

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  undefined4 *puVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  float *pfVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  float *pfVar21;
  float *pfVar22;
  int iVar23;
  float *pfVar24;
  int iVar25;
  long lVar26;
  undefined1 (*pauVar27) [16];
  long lVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int p_3;
  long lVar34;
  int p_4;
  bool bVar35;
  float fVar36;
  float fVar44;
  float fVar45;
  v4sf one_4;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar47;
  float fVar48;
  float fVar78;
  float fVar80;
  __m128 pos_4;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar82;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar79;
  float fVar81;
  float fVar83;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128 pos;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar125;
  float fVar126;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  __m128 pos_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  __m128 pos_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  __m128 _a;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  __m128 _b;
  undefined1 auVar165 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float *local_d0;
  int *local_c8;
  size_t local_c0;
  int local_b8;
  Allocator *local_b0;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  int local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  Option opt_flatten;
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar11 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar11;
  }
  local_a8 = bottom_blob->dims;
  if (local_a8 == 2) {
    iVar11 = (this->super_InnerProduct).num_output;
    local_a4 = bottom_blob->w;
    if (local_a4 == (this->super_InnerProduct).weight_data_size / iVar11) {
      Mat::create(top_blob,iVar11,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar11 = (this->super_InnerProduct).activation_type;
      iVar20 = bottom_blob->w;
      uVar4 = top_blob->w;
      iVar23 = bottom_blob->elempack;
      bVar19 = (uVar4 & 3) == 0 & opt->use_packing_layout;
      uVar12 = 0;
      iVar25 = 0;
      if (0 < iVar20) {
        iVar25 = iVar20;
      }
      pvVar5 = (this->super_InnerProduct).bias_data.data;
      uVar10 = (int)uVar4 >> 2;
      if ((int)uVar4 >> 2 < 1) {
        uVar10 = uVar12;
      }
      local_88 = (ulong)uVar10;
      if ((int)uVar4 < 1) {
        uVar4 = uVar12;
      }
      uVar10 = bottom_blob->h;
      if (bottom_blob->h < 1) {
        uVar10 = uVar12;
      }
      local_80 = (ulong)uVar10;
      uVar32 = 0;
      do {
        if (uVar32 == local_80) {
          return 0;
        }
        if ((iVar23 == 4 & bVar19) != 0) {
          pauVar13 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (uVar18 = 0; uVar18 != local_88; uVar18 = uVar18 + 1) {
            if (pvVar5 == (void *)0x0) {
              auVar61 = ZEXT816(0);
            }
            else {
              auVar61 = *(undefined1 (*) [16])((long)pvVar5 + uVar18 * 0x10);
            }
            lVar26 = bottom_blob->elemsize * uVar32 * (long)bottom_blob->w;
            pvVar6 = bottom_blob->data;
            lVar31 = 0;
            auVar113 = auVar61;
            auVar72 = auVar61;
            auVar86 = auVar61;
            iVar30 = iVar25;
            while( true ) {
              bVar35 = iVar30 == 0;
              iVar30 = iVar30 + -1;
              fVar48 = auVar86._0_4_;
              fVar112 = auVar72._0_4_;
              fVar36 = auVar113._0_4_;
              fVar47 = auVar61._0_4_;
              fVar79 = auVar86._4_4_;
              fVar83 = auVar86._12_4_;
              fVar125 = auVar72._4_4_;
              fVar127 = auVar72._12_4_;
              fVar44 = auVar113._4_4_;
              fVar46 = auVar113._12_4_;
              fVar78 = auVar61._4_4_;
              fVar80 = auVar61._8_4_;
              fVar82 = auVar61._12_4_;
              fVar81 = auVar86._8_4_;
              fVar126 = auVar72._8_4_;
              fVar45 = auVar113._8_4_;
              if (bVar35) break;
              fVar166 = *(float *)((long)pvVar6 + lVar31 + lVar26);
              fVar167 = *(float *)((long)pvVar6 + lVar31 + lVar26 + 4);
              fVar168 = *(float *)((long)pvVar6 + lVar31 + lVar26 + 8);
              fVar169 = *(float *)((long)pvVar6 + lVar31 + lVar26 + 0xc);
              pfVar21 = (float *)((long)(this->weight_data_tm).data +
                                 lVar31 + (this->weight_data_tm).elemsize * uVar18 *
                                          (long)(this->weight_data_tm).w);
              fVar171 = *pfVar21;
              fVar175 = pfVar21[1];
              fVar177 = pfVar21[2];
              fVar179 = pfVar21[3];
              auVar86._0_4_ = fVar48 + fVar166 * fVar171;
              auVar86._4_4_ = fVar79 + fVar166 * fVar175;
              auVar86._8_4_ = fVar81 + fVar166 * fVar177;
              auVar86._12_4_ = fVar83 + fVar166 * fVar179;
              auVar72._0_4_ = fVar112 + fVar167 * fVar171;
              auVar72._4_4_ = fVar125 + fVar167 * fVar175;
              auVar72._8_4_ = fVar126 + fVar167 * fVar177;
              auVar72._12_4_ = fVar127 + fVar167 * fVar179;
              auVar113._0_4_ = fVar36 + fVar168 * fVar171;
              auVar113._4_4_ = fVar44 + fVar168 * fVar175;
              auVar113._8_4_ = fVar45 + fVar168 * fVar177;
              auVar113._12_4_ = fVar46 + fVar168 * fVar179;
              auVar61._0_4_ = fVar47 + fVar169 * fVar171;
              auVar61._4_4_ = fVar78 + fVar169 * fVar175;
              auVar61._8_4_ = fVar80 + fVar169 * fVar177;
              auVar61._12_4_ = fVar82 + fVar169 * fVar179;
              lVar31 = lVar31 + 0x10;
            }
            auVar84 = auVar86;
            auVar128 = auVar72;
            auVar146 = auVar113;
            auVar154 = auVar61;
            if (5 < iVar11 - 1U) goto switchD_00287b40_caseD_1;
            auVar84 = maxps(auVar86,ZEXT816(0));
            auVar128 = maxps(auVar72,ZEXT816(0));
            auVar146 = maxps(auVar113,ZEXT816(0));
            auVar154 = maxps(auVar61,ZEXT816(0));
            switch(iVar11) {
            case 2:
              auVar86 = minps(auVar86,ZEXT816(0));
              fVar47 = *(this->super_InnerProduct).activation_params.data;
              auVar85._0_4_ = auVar84._0_4_ + auVar86._0_4_ * fVar47;
              auVar85._4_4_ = auVar84._4_4_ + auVar86._4_4_ * fVar47;
              auVar85._8_4_ = auVar84._8_4_ + auVar86._8_4_ * fVar47;
              auVar85._12_4_ = auVar84._12_4_ + auVar86._12_4_ * fVar47;
              auVar72 = minps(auVar72,ZEXT816(0));
              auVar129._0_4_ = auVar128._0_4_ + auVar72._0_4_ * fVar47;
              auVar129._4_4_ = auVar128._4_4_ + auVar72._4_4_ * fVar47;
              auVar129._8_4_ = auVar128._8_4_ + auVar72._8_4_ * fVar47;
              auVar129._12_4_ = auVar128._12_4_ + auVar72._12_4_ * fVar47;
              auVar113 = minps(auVar113,ZEXT816(0));
              auVar147._0_4_ = auVar146._0_4_ + auVar113._0_4_ * fVar47;
              auVar147._4_4_ = auVar146._4_4_ + auVar113._4_4_ * fVar47;
              auVar147._8_4_ = auVar146._8_4_ + auVar113._8_4_ * fVar47;
              auVar147._12_4_ = auVar146._12_4_ + auVar113._12_4_ * fVar47;
              auVar61 = minps(auVar61,ZEXT816(0));
              auVar155._0_4_ = auVar154._0_4_ + auVar61._0_4_ * fVar47;
              auVar155._4_4_ = auVar154._4_4_ + auVar61._4_4_ * fVar47;
              auVar155._8_4_ = auVar154._8_4_ + auVar61._8_4_ * fVar47;
              auVar155._12_4_ = auVar154._12_4_ + auVar61._12_4_ * fVar47;
              auVar84 = auVar85;
              auVar128 = auVar129;
              auVar146 = auVar147;
              auVar154 = auVar155;
              break;
            case 3:
              puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar3 = *puVar7;
              uVar2 = puVar7[1];
              auVar88._4_4_ = uVar3;
              auVar88._0_4_ = uVar3;
              auVar88._8_4_ = uVar3;
              auVar88._12_4_ = uVar3;
              auVar134._4_4_ = uVar2;
              auVar134._0_4_ = uVar2;
              auVar134._8_4_ = uVar2;
              auVar134._12_4_ = uVar2;
              auVar86 = maxps(auVar86,auVar88);
              auVar84 = minps(auVar86,auVar134);
              auVar72 = maxps(auVar72,auVar88);
              auVar128 = minps(auVar72,auVar134);
              auVar113 = maxps(auVar113,auVar88);
              auVar146 = minps(auVar113,auVar134);
              auVar61 = maxps(auVar61,auVar88);
              auVar154 = minps(auVar61,auVar134);
              break;
            case 4:
              auVar143._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar143._8_4_ = -fVar81;
              auVar143._12_4_ = -fVar83;
              auVar86 = minps(auVar143,_DAT_005397f0);
              auVar86 = maxps(auVar86,_DAT_00539800);
              fVar112 = auVar86._0_4_ * 1.442695 + 0.5;
              fVar125 = auVar86._4_4_ * 1.442695 + 0.5;
              fVar48 = auVar86._8_4_ * 1.442695 + 0.5;
              fVar79 = auVar86._12_4_ * 1.442695 + 0.5;
              fVar47 = (float)(int)fVar112;
              fVar78 = (float)(int)fVar125;
              fVar36 = (float)(int)fVar48;
              fVar44 = (float)(int)fVar79;
              fVar81 = (float)DAT_00539830;
              fVar83 = DAT_00539830._4_4_;
              fVar166 = DAT_00539830._8_4_;
              fVar167 = DAT_00539830._12_4_;
              fVar47 = fVar47 - (float)(-(uint)(fVar112 < fVar47) & (uint)fVar81);
              fVar78 = fVar78 - (float)(-(uint)(fVar125 < fVar78) & (uint)fVar83);
              fVar36 = fVar36 - (float)(-(uint)(fVar48 < fVar36) & (uint)fVar166);
              fVar44 = fVar44 - (float)(-(uint)(fVar79 < fVar44) & (uint)fVar167);
              fVar112 = auVar86._0_4_ - fVar47 * 0.6931472;
              fVar125 = auVar86._4_4_ - fVar78 * 0.6931472;
              fVar48 = auVar86._8_4_ - fVar36 * 0.6931472;
              fVar79 = auVar86._12_4_ - fVar44 * 0.6931472;
              auVar135._0_4_ =
                   (float)((int)fVar47 * 0x800000 + (int)fVar81) *
                   (fVar112 + fVar81 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5) * fVar112 * fVar112) +
                   fVar81;
              auVar135._4_4_ =
                   (float)((int)fVar78 * 0x800000 + (int)fVar83) *
                   (fVar125 + fVar83 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                     0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5) * fVar125 * fVar125) +
                   fVar83;
              auVar135._8_4_ =
                   (float)((int)fVar36 * 0x800000 + (int)fVar166) *
                   (fVar48 + fVar166 +
                   (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                     0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48) +
                   fVar166;
              auVar135._12_4_ =
                   (float)((int)fVar44 * 0x800000 + (int)fVar167) *
                   (fVar79 + fVar167 +
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * fVar79 * fVar79) +
                   fVar167;
              auVar84 = divps(_DAT_00539830,auVar135);
              auVar119._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar119._8_4_ = -fVar126;
              auVar119._12_4_ = -fVar127;
              auVar72 = minps(auVar119,_DAT_005397f0);
              auVar72 = maxps(auVar72,_DAT_00539800);
              fVar47 = auVar72._0_4_ * 1.442695 + 0.5;
              fVar78 = auVar72._4_4_ * 1.442695 + 0.5;
              fVar36 = auVar72._8_4_ * 1.442695 + 0.5;
              fVar44 = auVar72._12_4_ * 1.442695 + 0.5;
              fVar112 = (float)(int)fVar47;
              fVar125 = (float)(int)fVar78;
              fVar126 = (float)(int)fVar36;
              fVar127 = (float)(int)fVar44;
              fVar112 = fVar112 - (float)(-(uint)(fVar47 < fVar112) & (uint)fVar81);
              fVar125 = fVar125 - (float)(-(uint)(fVar78 < fVar125) & (uint)fVar83);
              fVar126 = fVar126 - (float)(-(uint)(fVar36 < fVar126) & (uint)fVar166);
              fVar127 = fVar127 - (float)(-(uint)(fVar44 < fVar127) & (uint)fVar167);
              fVar48 = (float)DAT_00539840;
              fVar79 = DAT_00539840._4_4_;
              fVar168 = DAT_00539840._8_4_;
              fVar169 = DAT_00539840._12_4_;
              fVar47 = auVar72._0_4_ - fVar112 * fVar48;
              fVar78 = auVar72._4_4_ - fVar125 * fVar79;
              fVar36 = auVar72._8_4_ - fVar126 * fVar168;
              fVar44 = auVar72._12_4_ - fVar127 * fVar169;
              auVar144._0_4_ =
                   (float)((int)fVar112 * 0x800000 + (int)fVar81) *
                   (fVar47 + fVar81 +
                   (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                     0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar81
              ;
              auVar144._4_4_ =
                   (float)((int)fVar125 * 0x800000 + (int)fVar83) *
                   (fVar78 + fVar83 +
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) * fVar78 * fVar78) + fVar83
              ;
              auVar144._8_4_ =
                   (float)((int)fVar126 * 0x800000 + (int)fVar166) *
                   (fVar36 + fVar166 +
                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                     0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5) * fVar36 * fVar36) +
                   fVar166;
              auVar144._12_4_ =
                   (float)((int)fVar127 * 0x800000 + (int)fVar167) *
                   (fVar44 + fVar167 +
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * fVar44 * fVar44) +
                   fVar167;
              auVar128 = divps(_DAT_00539830,auVar144);
              auVar50._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
              auVar50._8_4_ = -fVar45;
              auVar50._12_4_ = -fVar46;
              auVar113 = minps(auVar50,_DAT_005397f0);
              auVar113 = maxps(auVar113,_DAT_00539800);
              fVar47 = auVar113._0_4_ * 1.442695 + 0.5;
              fVar78 = auVar113._4_4_ * 1.442695 + 0.5;
              fVar36 = auVar113._8_4_ * 1.442695 + 0.5;
              fVar44 = auVar113._12_4_ * 1.442695 + 0.5;
              fVar45 = (float)(int)fVar47;
              fVar46 = (float)(int)fVar78;
              fVar112 = (float)(int)fVar36;
              fVar125 = (float)(int)fVar44;
              fVar45 = fVar45 - (float)(-(uint)(fVar47 < fVar45) & (uint)fVar81);
              fVar46 = fVar46 - (float)(-(uint)(fVar78 < fVar46) & (uint)fVar83);
              fVar112 = fVar112 - (float)(-(uint)(fVar36 < fVar112) & (uint)fVar166);
              fVar125 = fVar125 - (float)(-(uint)(fVar44 < fVar125) & (uint)fVar167);
              fVar47 = auVar113._0_4_ - fVar45 * fVar48;
              fVar78 = auVar113._4_4_ - fVar46 * fVar79;
              fVar36 = auVar113._8_4_ - fVar112 * fVar168;
              fVar44 = auVar113._12_4_ - fVar125 * fVar169;
              auVar145._0_4_ =
                   (float)((int)fVar45 * 0x800000 + (int)fVar81) *
                   (fVar47 + fVar81 +
                   (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                     0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar81
              ;
              auVar145._4_4_ =
                   (float)((int)fVar46 * 0x800000 + (int)fVar83) *
                   (fVar78 + fVar83 +
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) * fVar78 * fVar78) + fVar83
              ;
              auVar145._8_4_ =
                   (float)((int)fVar112 * 0x800000 + (int)fVar166) *
                   (fVar36 + fVar166 +
                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                     0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5) * fVar36 * fVar36) +
                   fVar166;
              auVar145._12_4_ =
                   (float)((int)fVar125 * 0x800000 + (int)fVar167) *
                   (fVar44 + fVar167 +
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * fVar44 * fVar44) +
                   fVar167;
              auVar146 = divps(_DAT_00539830,auVar145);
              auVar37._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
              auVar37._8_4_ = -fVar80;
              auVar37._12_4_ = -fVar82;
              auVar61 = minps(auVar37,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar47 = auVar61._0_4_ * 1.442695 + 0.5;
              fVar78 = auVar61._4_4_ * 1.442695 + 0.5;
              fVar80 = auVar61._8_4_ * 1.442695 + 0.5;
              fVar82 = auVar61._12_4_ * 1.442695 + 0.5;
              fVar36 = (float)(int)fVar47;
              fVar44 = (float)(int)fVar78;
              fVar45 = (float)(int)fVar80;
              fVar46 = (float)(int)fVar82;
              fVar36 = fVar36 - (float)(-(uint)(fVar47 < fVar36) & (uint)fVar81);
              fVar44 = fVar44 - (float)(-(uint)(fVar78 < fVar44) & (uint)fVar83);
              fVar45 = fVar45 - (float)(-(uint)(fVar80 < fVar45) & (uint)fVar166);
              fVar46 = fVar46 - (float)(-(uint)(fVar82 < fVar46) & (uint)fVar167);
              fVar47 = auVar61._0_4_ - fVar36 * fVar48;
              fVar78 = auVar61._4_4_ - fVar44 * fVar79;
              fVar80 = auVar61._8_4_ - fVar45 * fVar168;
              fVar82 = auVar61._12_4_ - fVar46 * fVar169;
              auVar51._0_4_ =
                   (float)((int)fVar36 * 0x800000 + (int)fVar81) *
                   (fVar47 + fVar81 +
                   (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                     0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar81
              ;
              auVar51._4_4_ =
                   (float)((int)fVar44 * 0x800000 + (int)fVar83) *
                   (fVar78 + fVar83 +
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + 0.5) * fVar78 * fVar78) + fVar83
              ;
              auVar51._8_4_ =
                   (float)((int)fVar45 * 0x800000 + (int)fVar166) *
                   (fVar80 + fVar166 +
                   (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
                     0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) * fVar80 * fVar80) +
                   fVar166;
              auVar51._12_4_ =
                   (float)((int)fVar46 * 0x800000 + (int)fVar167) *
                   (fVar82 + fVar167 +
                   (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                     0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82) +
                   fVar167;
              auVar154 = divps(_DAT_00539830,auVar51);
              break;
            case 5:
              auVar86 = minps(auVar86,_DAT_005397f0);
              auVar86 = maxps(auVar86,_DAT_00539800);
              fVar170 = (float)DAT_00539820;
              fVar174 = DAT_00539820._4_4_;
              fVar176 = DAT_00539820._8_4_;
              fVar178 = DAT_00539820._12_4_;
              fVar166 = auVar86._0_4_ * 1.442695 + fVar170;
              fVar167 = auVar86._4_4_ * 1.442695 + fVar174;
              fVar168 = auVar86._8_4_ * 1.442695 + fVar176;
              fVar169 = auVar86._12_4_ * 1.442695 + fVar178;
              fVar171 = (float)(int)fVar166;
              fVar175 = (float)(int)fVar167;
              fVar177 = (float)(int)fVar168;
              fVar179 = (float)(int)fVar169;
              fVar171 = fVar171 - (float)(-(uint)(fVar166 < fVar171) & 0x3f800000);
              fVar175 = fVar175 - (float)(-(uint)(fVar167 < fVar175) & 0x3f800000);
              fVar177 = fVar177 - (float)(-(uint)(fVar168 < fVar177) & 0x3f800000);
              fVar179 = fVar179 - (float)(-(uint)(fVar169 < fVar179) & 0x3f800000);
              fVar166 = auVar86._0_4_ - fVar171 * 0.6931472;
              fVar167 = auVar86._4_4_ - fVar175 * 0.6931472;
              fVar168 = auVar86._8_4_ - fVar177 * 0.6931472;
              fVar169 = auVar86._12_4_ - fVar179 * 0.6931472;
              auVar130._0_4_ =
                   (float)((int)fVar171 * 0x800000 + 0x3f800000) *
                   (fVar166 + 1.0 +
                   (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                     0.041665796) * fVar166 + 0.16666666) * fVar166 + fVar170) * fVar166 * fVar166)
                   + 1.0;
              auVar130._4_4_ =
                   (float)((int)fVar175 * 0x800000 + 0x3f800000) *
                   (fVar167 + 1.0 +
                   (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                     0.041665796) * fVar167 + 0.16666666) * fVar167 + fVar174) * fVar167 * fVar167)
                   + 1.0;
              auVar130._8_4_ =
                   (float)((int)fVar177 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar176) * fVar168 * fVar168)
                   + 1.0;
              auVar130._12_4_ =
                   (float)((int)fVar179 * 0x800000 + 0x3f800000) *
                   (fVar169 + 1.0 +
                   (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
                     0.041665796) * fVar169 + 0.16666666) * fVar169 + fVar178) * fVar169 * fVar169)
                   + 1.0;
              auVar86 = maxps(auVar130,_DAT_005398a0);
              auVar131._0_8_ = auVar86._0_8_ & 0x807fffff807fffff;
              auVar131._8_4_ = auVar86._8_4_ & 0x807fffff;
              auVar131._12_4_ = auVar86._12_4_ & 0x807fffff;
              auVar131 = auVar131 | _DAT_00539820;
              fVar166 = auVar131._0_4_;
              fVar168 = auVar131._4_4_;
              fVar171 = auVar131._8_4_;
              fVar177 = auVar131._12_4_;
              fVar167 = fVar166 + -1.0 + (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar166);
              fVar169 = fVar168 + -1.0 + (float)(-(uint)(fVar168 < 0.70710677) & (uint)fVar168);
              fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
              fVar179 = fVar177 + -1.0 + (float)(-(uint)(fVar177 < 0.70710677) & (uint)fVar177);
              auVar132._0_8_ =
                   CONCAT44(-(uint)(auVar130._4_4_ <= 0.0),-(uint)(auVar130._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar132._8_4_ = -(uint)(auVar130._8_4_ <= 0.0) & 0x7fffffff;
              auVar132._12_4_ = -(uint)(auVar130._12_4_ <= 0.0) & 0x7fffffff;
              auVar87._0_4_ =
                   ~-(uint)(auVar130._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar86._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar166 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar167 +
                          (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                                 fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                              -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) *
                            fVar167 + 0.3333333) * fVar167 + -0.5) * fVar167 * fVar167) * -2.0);
              auVar87._4_4_ =
                   ~-(uint)(auVar130._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar86._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar168 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar169 +
                          (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) *
                                 fVar169 + -0.12420141) * fVar169 + 0.14249323) * fVar169 +
                              -0.16668057) * fVar169 + 0.20000714) * fVar169 + -0.24999994) *
                            fVar169 + 0.3333333) * fVar169 + -0.5) * fVar169 * fVar169) * -2.0);
              auVar87._8_4_ =
                   ~-(uint)(auVar130._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar86._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar175 +
                          (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                 fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                              -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                            fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
              auVar87._12_4_ =
                   ~-(uint)(auVar130._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar86._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar177 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar179 +
                          (((((((((fVar179 * 0.070376836 + -0.1151461) * fVar179 + 0.116769984) *
                                 fVar179 + -0.12420141) * fVar179 + 0.14249323) * fVar179 +
                              -0.16668057) * fVar179 + 0.20000714) * fVar179 + -0.24999994) *
                            fVar179 + 0.3333333) * fVar179 + -0.5) * fVar179 * fVar179) * -2.0);
              auVar86 = minps(auVar87 | auVar132,_DAT_005397f0);
              auVar86 = maxps(auVar86,_DAT_00539800);
              fVar166 = auVar86._0_4_ * 1.442695 + fVar170;
              fVar167 = auVar86._4_4_ * 1.442695 + fVar174;
              fVar168 = auVar86._8_4_ * 1.442695 + fVar176;
              fVar169 = auVar86._12_4_ * 1.442695 + fVar178;
              fVar171 = (float)(int)fVar166;
              fVar175 = (float)(int)fVar167;
              fVar177 = (float)(int)fVar168;
              fVar179 = (float)(int)fVar169;
              fVar171 = fVar171 - (float)(-(uint)(fVar166 < fVar171) & 0x3f800000);
              fVar175 = fVar175 - (float)(-(uint)(fVar167 < fVar175) & 0x3f800000);
              fVar177 = fVar177 - (float)(-(uint)(fVar168 < fVar177) & 0x3f800000);
              fVar179 = fVar179 - (float)(-(uint)(fVar169 < fVar179) & 0x3f800000);
              fVar166 = auVar86._0_4_ - fVar171 * 0.6931472;
              fVar167 = auVar86._4_4_ - fVar175 * 0.6931472;
              fVar168 = auVar86._8_4_ - fVar177 * 0.6931472;
              fVar169 = auVar86._12_4_ - fVar179 * 0.6931472;
              auVar148._0_4_ =
                   (float)((int)fVar171 * 0x800000 + 0x3f800000) *
                   (fVar166 + 1.0 +
                   (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                     0.041665796) * fVar166 + 0.16666666) * fVar166 + fVar170) * fVar166 * fVar166)
                   + 1.0;
              auVar148._4_4_ =
                   (float)((int)fVar175 * 0x800000 + 0x3f800000) *
                   (fVar167 + 1.0 +
                   (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                     0.041665796) * fVar167 + 0.16666666) * fVar167 + fVar174) * fVar167 * fVar167)
                   + 1.0;
              auVar148._8_4_ =
                   (float)((int)fVar177 * 0x800000 + 0x3f800000) *
                   (fVar168 + 1.0 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar176) * fVar168 * fVar168)
                   + 1.0;
              auVar148._12_4_ =
                   (float)((int)fVar179 * 0x800000 + 0x3f800000) *
                   (fVar169 + 1.0 +
                   (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
                     0.041665796) * fVar169 + 0.16666666) * fVar169 + fVar178) * fVar169 * fVar169)
                   + 1.0;
              auVar86 = divps(_DAT_0053a2b0,auVar148);
              auVar84._0_4_ = (auVar86._0_4_ + -1.0) * fVar48;
              auVar84._4_4_ = (auVar86._4_4_ + -1.0) * fVar79;
              auVar84._8_4_ = (auVar86._8_4_ + -1.0) * fVar81;
              auVar84._12_4_ = (auVar86._12_4_ + -1.0) * fVar83;
              auVar72 = minps(auVar72,_DAT_005397f0);
              auVar72 = maxps(auVar72,_DAT_00539800);
              fVar48 = auVar72._0_4_ * 1.442695 + fVar170;
              fVar79 = auVar72._4_4_ * 1.442695 + fVar174;
              fVar81 = auVar72._8_4_ * 1.442695 + fVar176;
              fVar83 = auVar72._12_4_ * 1.442695 + fVar178;
              fVar166 = (float)(int)fVar48;
              fVar167 = (float)(int)fVar79;
              fVar168 = (float)(int)fVar81;
              fVar169 = (float)(int)fVar83;
              fVar166 = fVar166 - (float)(-(uint)(fVar48 < fVar166) & 0x3f800000);
              fVar167 = fVar167 - (float)(-(uint)(fVar79 < fVar167) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar81 < fVar168) & 0x3f800000);
              fVar169 = fVar169 - (float)(-(uint)(fVar83 < fVar169) & 0x3f800000);
              fVar48 = auVar72._0_4_ - fVar166 * 0.6931472;
              fVar79 = auVar72._4_4_ - fVar167 * 0.6931472;
              fVar81 = auVar72._8_4_ - fVar168 * 0.6931472;
              fVar83 = auVar72._12_4_ - fVar169 * 0.6931472;
              auVar137._0_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar48 + 1.0 +
                   (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                     0.041665796) * fVar48 + 0.16666666) * fVar48 + fVar170) * fVar48 * fVar48) +
                   1.0;
              auVar137._4_4_ =
                   (float)((int)fVar167 * 0x800000 + 0x3f800000) *
                   (fVar79 + 1.0 +
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + fVar174) * fVar79 * fVar79) +
                   1.0;
              auVar137._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar81 + 1.0 +
                   (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                     0.041665796) * fVar81 + 0.16666666) * fVar81 + fVar176) * fVar81 * fVar81) +
                   1.0;
              auVar137._12_4_ =
                   (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                   (fVar83 + 1.0 +
                   (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                     0.041665796) * fVar83 + 0.16666666) * fVar83 + fVar178) * fVar83 * fVar83) +
                   1.0;
              auVar72 = maxps(auVar137,_DAT_005398a0);
              auVar138._0_8_ = auVar72._0_8_ & 0x807fffff807fffff;
              auVar138._8_4_ = auVar72._8_4_ & 0x807fffff;
              auVar138._12_4_ = auVar72._12_4_ & 0x807fffff;
              auVar138 = auVar138 | _DAT_00539820;
              fVar48 = auVar138._0_4_;
              fVar81 = auVar138._4_4_;
              fVar166 = auVar138._8_4_;
              fVar168 = auVar138._12_4_;
              fVar79 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
              fVar83 = fVar81 + -1.0 + (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
              fVar167 = fVar166 + -1.0 + (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar166);
              fVar169 = fVar168 + -1.0 + (float)(-(uint)(fVar168 < 0.70710677) & (uint)fVar168);
              auVar139._0_8_ =
                   CONCAT44(-(uint)(auVar137._4_4_ <= 0.0),-(uint)(auVar137._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar139._8_4_ = -(uint)(auVar137._8_4_ <= 0.0) & 0x7fffffff;
              auVar139._12_4_ = -(uint)(auVar137._12_4_ <= 0.0) & 0x7fffffff;
              auVar133._0_4_ =
                   ~-(uint)(auVar137._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar79
                          + (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                   fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 +
                                -0.16668057) * fVar79 + 0.20000714) * fVar79 + -0.24999994) * fVar79
                             + 0.3333333) * fVar79 + -0.5) * fVar79 * fVar79) * -2.0);
              auVar133._4_4_ =
                   ~-(uint)(auVar137._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar81 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar83
                          + (((((((((fVar83 * 0.070376836 + -0.1151461) * fVar83 + 0.116769984) *
                                   fVar83 + -0.12420141) * fVar83 + 0.14249323) * fVar83 +
                                -0.16668057) * fVar83 + 0.20000714) * fVar83 + -0.24999994) * fVar83
                             + 0.3333333) * fVar83 + -0.5) * fVar83 * fVar83) * -2.0);
              auVar133._8_4_ =
                   ~-(uint)(auVar137._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar166 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar167 +
                          (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                                 fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                              -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) *
                            fVar167 + 0.3333333) * fVar167 + -0.5) * fVar167 * fVar167) * -2.0);
              auVar133._12_4_ =
                   ~-(uint)(auVar137._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar72._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar168 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar169 +
                          (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) *
                                 fVar169 + -0.12420141) * fVar169 + 0.14249323) * fVar169 +
                              -0.16668057) * fVar169 + 0.20000714) * fVar169 + -0.24999994) *
                            fVar169 + 0.3333333) * fVar169 + -0.5) * fVar169 * fVar169) * -2.0);
              auVar72 = minps(auVar133 | auVar139,_DAT_005397f0);
              auVar72 = maxps(auVar72,_DAT_00539800);
              fVar48 = auVar72._0_4_ * 1.442695 + fVar170;
              fVar79 = auVar72._4_4_ * 1.442695 + fVar174;
              fVar81 = auVar72._8_4_ * 1.442695 + fVar176;
              fVar83 = auVar72._12_4_ * 1.442695 + fVar178;
              fVar166 = (float)(int)fVar48;
              fVar167 = (float)(int)fVar79;
              fVar168 = (float)(int)fVar81;
              fVar169 = (float)(int)fVar83;
              fVar166 = fVar166 - (float)(-(uint)(fVar48 < fVar166) & 0x3f800000);
              fVar167 = fVar167 - (float)(-(uint)(fVar79 < fVar167) & 0x3f800000);
              fVar168 = fVar168 - (float)(-(uint)(fVar81 < fVar168) & 0x3f800000);
              fVar169 = fVar169 - (float)(-(uint)(fVar83 < fVar169) & 0x3f800000);
              fVar48 = auVar72._0_4_ - fVar166 * 0.6931472;
              fVar79 = auVar72._4_4_ - fVar167 * 0.6931472;
              fVar81 = auVar72._8_4_ - fVar168 * 0.6931472;
              fVar83 = auVar72._12_4_ - fVar169 * 0.6931472;
              auVar149._0_4_ =
                   (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                   (fVar48 + 1.0 +
                   (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                     0.041665796) * fVar48 + 0.16666666) * fVar48 + fVar170) * fVar48 * fVar48) +
                   1.0;
              auVar149._4_4_ =
                   (float)((int)fVar167 * 0x800000 + 0x3f800000) *
                   (fVar79 + 1.0 +
                   (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                     0.041665796) * fVar79 + 0.16666666) * fVar79 + fVar174) * fVar79 * fVar79) +
                   1.0;
              auVar149._8_4_ =
                   (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                   (fVar81 + 1.0 +
                   (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81 +
                     0.041665796) * fVar81 + 0.16666666) * fVar81 + fVar176) * fVar81 * fVar81) +
                   1.0;
              auVar149._12_4_ =
                   (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                   (fVar83 + 1.0 +
                   (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
                     0.041665796) * fVar83 + 0.16666666) * fVar83 + fVar178) * fVar83 * fVar83) +
                   1.0;
              auVar72 = divps(_DAT_0053a2b0,auVar149);
              auVar128._0_4_ = (auVar72._0_4_ + -1.0) * fVar112;
              auVar128._4_4_ = (auVar72._4_4_ + -1.0) * fVar125;
              auVar128._8_4_ = (auVar72._8_4_ + -1.0) * fVar126;
              auVar128._12_4_ = (auVar72._12_4_ + -1.0) * fVar127;
              auVar113 = minps(auVar113,_DAT_005397f0);
              auVar113 = maxps(auVar113,_DAT_00539800);
              fVar112 = auVar113._0_4_ * 1.442695 + fVar170;
              fVar125 = auVar113._4_4_ * 1.442695 + fVar174;
              fVar126 = auVar113._8_4_ * 1.442695 + fVar176;
              fVar127 = auVar113._12_4_ * 1.442695 + fVar178;
              fVar48 = (float)(int)fVar112;
              fVar79 = (float)(int)fVar125;
              fVar81 = (float)(int)fVar126;
              fVar83 = (float)(int)fVar127;
              fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & 0x3f800000);
              fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & 0x3f800000);
              fVar81 = fVar81 - (float)(-(uint)(fVar126 < fVar81) & 0x3f800000);
              fVar83 = fVar83 - (float)(-(uint)(fVar127 < fVar83) & 0x3f800000);
              fVar112 = auVar113._0_4_ - fVar48 * 0.6931472;
              fVar125 = auVar113._4_4_ - fVar79 * 0.6931472;
              fVar126 = auVar113._8_4_ - fVar81 * 0.6931472;
              fVar127 = auVar113._12_4_ - fVar83 * 0.6931472;
              auVar140._0_4_ =
                   (float)((int)fVar48 * 0x800000 + 0x3f800000) *
                   (fVar112 + 1.0 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar170) * fVar112 * fVar112)
                   + 1.0;
              auVar140._4_4_ =
                   (float)((int)fVar79 * 0x800000 + 0x3f800000) *
                   (fVar125 + 1.0 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                     0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar174) * fVar125 * fVar125)
                   + 1.0;
              auVar140._8_4_ =
                   (float)((int)fVar81 * 0x800000 + 0x3f800000) *
                   (fVar126 + 1.0 +
                   (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                     0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar176) * fVar126 * fVar126)
                   + 1.0;
              auVar140._12_4_ =
                   (float)((int)fVar83 * 0x800000 + 0x3f800000) *
                   (fVar127 + 1.0 +
                   (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                     0.041665796) * fVar127 + 0.16666666) * fVar127 + fVar178) * fVar127 * fVar127)
                   + 1.0;
              auVar113 = maxps(auVar140,_DAT_005398a0);
              auVar141._0_8_ = auVar113._0_8_ & 0x807fffff807fffff;
              auVar141._8_4_ = auVar113._8_4_ & 0x807fffff;
              auVar141._12_4_ = auVar113._12_4_ & 0x807fffff;
              auVar141 = auVar141 | _DAT_00539820;
              fVar112 = auVar141._0_4_;
              fVar126 = auVar141._4_4_;
              fVar48 = auVar141._8_4_;
              fVar81 = auVar141._12_4_;
              fVar125 = fVar112 + -1.0 + (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
              fVar127 = fVar126 + -1.0 + (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
              fVar79 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
              fVar83 = fVar81 + -1.0 + (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
              auVar142._0_8_ =
                   CONCAT44(-(uint)(auVar140._4_4_ <= 0.0),-(uint)(auVar140._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar142._8_4_ = -(uint)(auVar140._8_4_ <= 0.0) & 0x7fffffff;
              auVar142._12_4_ = -(uint)(auVar140._12_4_ <= 0.0) & 0x7fffffff;
              auVar114._0_4_ =
                   ~-(uint)(auVar140._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar113._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar112 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar125 +
                          (((((((((fVar125 * 0.070376836 + -0.1151461) * fVar125 + 0.116769984) *
                                 fVar125 + -0.12420141) * fVar125 + 0.14249323) * fVar125 +
                              -0.16668057) * fVar125 + 0.20000714) * fVar125 + -0.24999994) *
                            fVar125 + 0.3333333) * fVar125 + -0.5) * fVar125 * fVar125) * -2.0);
              auVar114._4_4_ =
                   ~-(uint)(auVar140._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar113._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar126 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar127 +
                          (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                                 fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                              -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) *
                            fVar127 + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) * -2.0);
              auVar114._8_4_ =
                   ~-(uint)(auVar140._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar113._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar79
                          + (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                   fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 +
                                -0.16668057) * fVar79 + 0.20000714) * fVar79 + -0.24999994) * fVar79
                             + 0.3333333) * fVar79 + -0.5) * fVar79 * fVar79) * -2.0);
              auVar114._12_4_ =
                   ~-(uint)(auVar140._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar113._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar81 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar83
                          + (((((((((fVar83 * 0.070376836 + -0.1151461) * fVar83 + 0.116769984) *
                                   fVar83 + -0.12420141) * fVar83 + 0.14249323) * fVar83 +
                                -0.16668057) * fVar83 + 0.20000714) * fVar83 + -0.24999994) * fVar83
                             + 0.3333333) * fVar83 + -0.5) * fVar83 * fVar83) * -2.0);
              auVar113 = minps(auVar114 | auVar142,_DAT_005397f0);
              auVar113 = maxps(auVar113,_DAT_00539800);
              fVar112 = auVar113._0_4_ * 1.442695 + fVar170;
              fVar125 = auVar113._4_4_ * 1.442695 + fVar174;
              fVar126 = auVar113._8_4_ * 1.442695 + fVar176;
              fVar127 = auVar113._12_4_ * 1.442695 + fVar178;
              fVar48 = (float)(int)fVar112;
              fVar79 = (float)(int)fVar125;
              fVar81 = (float)(int)fVar126;
              fVar83 = (float)(int)fVar127;
              fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & 0x3f800000);
              fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & 0x3f800000);
              fVar81 = fVar81 - (float)(-(uint)(fVar126 < fVar81) & 0x3f800000);
              fVar83 = fVar83 - (float)(-(uint)(fVar127 < fVar83) & 0x3f800000);
              fVar112 = auVar113._0_4_ - fVar48 * 0.6931472;
              fVar125 = auVar113._4_4_ - fVar79 * 0.6931472;
              fVar126 = auVar113._8_4_ - fVar81 * 0.6931472;
              fVar127 = auVar113._12_4_ - fVar83 * 0.6931472;
              fVar166 = (float)DAT_00539880;
              fVar167 = DAT_00539880._4_4_;
              fVar168 = DAT_00539880._8_4_;
              fVar169 = DAT_00539880._12_4_;
              auVar156._0_4_ =
                   (float)((int)fVar48 * 0x800000 + 0x3f800000) *
                   (fVar112 + 1.0 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     fVar166) * fVar112 + 0.16666666) * fVar112 + fVar170) * fVar112 * fVar112) +
                   1.0;
              auVar156._4_4_ =
                   (float)((int)fVar79 * 0x800000 + 0x3f800000) *
                   (fVar125 + 1.0 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                     fVar167) * fVar125 + 0.16666666) * fVar125 + fVar174) * fVar125 * fVar125) +
                   1.0;
              auVar156._8_4_ =
                   (float)((int)fVar81 * 0x800000 + 0x3f800000) *
                   (fVar126 + 1.0 +
                   (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                     fVar168) * fVar126 + 0.16666666) * fVar126 + fVar176) * fVar126 * fVar126) +
                   1.0;
              auVar156._12_4_ =
                   (float)((int)fVar83 * 0x800000 + 0x3f800000) *
                   (fVar127 + 1.0 +
                   (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                     fVar169) * fVar127 + 0.16666666) * fVar127 + fVar178) * fVar127 * fVar127) +
                   1.0;
              auVar113 = divps(_DAT_0053a2b0,auVar156);
              auVar146._0_4_ = (auVar113._0_4_ + -1.0) * fVar36;
              auVar146._4_4_ = (auVar113._4_4_ + -1.0) * fVar44;
              auVar146._8_4_ = (auVar113._8_4_ + -1.0) * fVar45;
              auVar146._12_4_ = (auVar113._12_4_ + -1.0) * fVar46;
              auVar61 = minps(auVar61,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar36 = auVar61._0_4_ * 1.442695 + fVar170;
              fVar44 = auVar61._4_4_ * 1.442695 + fVar174;
              fVar45 = auVar61._8_4_ * 1.442695 + fVar176;
              fVar46 = auVar61._12_4_ * 1.442695 + fVar178;
              fVar112 = (float)(int)fVar36;
              fVar125 = (float)(int)fVar44;
              fVar126 = (float)(int)fVar45;
              fVar127 = (float)(int)fVar46;
              fVar112 = fVar112 - (float)(-(uint)(fVar36 < fVar112) & 0x3f800000);
              fVar125 = fVar125 - (float)(-(uint)(fVar44 < fVar125) & 0x3f800000);
              fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & 0x3f800000);
              fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & 0x3f800000);
              fVar36 = auVar61._0_4_ - fVar112 * 0.6931472;
              fVar44 = auVar61._4_4_ - fVar125 * 0.6931472;
              fVar45 = auVar61._8_4_ - fVar126 * 0.6931472;
              fVar46 = auVar61._12_4_ - fVar127 * 0.6931472;
              auVar115._0_4_ =
                   (float)((int)fVar112 * 0x800000 + 0x3f800000) *
                   (fVar36 + 1.0 +
                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                     fVar166) * fVar36 + 0.16666666) * fVar36 + fVar170) * fVar36 * fVar36) + 1.0;
              auVar115._4_4_ =
                   (float)((int)fVar125 * 0x800000 + 0x3f800000) *
                   (fVar44 + 1.0 +
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     fVar167) * fVar44 + 0.16666666) * fVar44 + fVar174) * fVar44 * fVar44) + 1.0;
              auVar115._8_4_ =
                   (float)((int)fVar126 * 0x800000 + 0x3f800000) *
                   (fVar45 + 1.0 +
                   (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                     fVar168) * fVar45 + 0.16666666) * fVar45 + fVar176) * fVar45 * fVar45) + 1.0;
              auVar115._12_4_ =
                   (float)((int)fVar127 * 0x800000 + 0x3f800000) *
                   (fVar46 + 1.0 +
                   (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                     fVar169) * fVar46 + 0.16666666) * fVar46 + fVar178) * fVar46 * fVar46) + 1.0;
              auVar61 = maxps(auVar115,_DAT_005398a0);
              auVar116._0_8_ = auVar61._0_8_ & 0x807fffff807fffff;
              auVar116._8_4_ = auVar61._8_4_ & 0x807fffff;
              auVar116._12_4_ = auVar61._12_4_ & 0x807fffff;
              auVar116 = auVar116 | _DAT_00539820;
              fVar36 = auVar116._0_4_;
              fVar45 = auVar116._4_4_;
              fVar112 = auVar116._8_4_;
              fVar126 = auVar116._12_4_;
              fVar44 = fVar36 + -1.0 + (float)(-(uint)(fVar36 < 0.70710677) & (uint)fVar36);
              fVar46 = fVar45 + -1.0 + (float)(-(uint)(fVar45 < 0.70710677) & (uint)fVar45);
              fVar125 = fVar112 + -1.0 + (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
              fVar127 = fVar126 + -1.0 + (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
              auVar117._0_8_ =
                   CONCAT44(-(uint)(auVar115._4_4_ <= 0.0),-(uint)(auVar115._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar117._8_4_ = -(uint)(auVar115._8_4_ <= 0.0) & 0x7fffffff;
              auVar117._12_4_ = -(uint)(auVar115._12_4_ <= 0.0) & 0x7fffffff;
              auVar49._0_4_ =
                   ~-(uint)(auVar115._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar36 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar44
                          + (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) *
                                   fVar44 + -0.12420141) * fVar44 + 0.14249323) * fVar44 +
                                -0.16668057) * fVar44 + 0.20000714) * fVar44 + -0.24999994) * fVar44
                             + 0.3333333) * fVar44 + -0.5) * fVar44 * fVar44) * -2.0);
              auVar49._4_4_ =
                   ~-(uint)(auVar115._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar45 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar46
                          + (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) *
                                   fVar46 + -0.12420141) * fVar46 + 0.14249323) * fVar46 +
                                -0.16668057) * fVar46 + 0.20000714) * fVar46 + -0.24999994) * fVar46
                             + 0.3333333) * fVar46 + -0.5) * fVar46 * fVar46) * -2.0);
              auVar49._8_4_ =
                   ~-(uint)(auVar115._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar112 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar125 +
                          (((((((((fVar125 * 0.070376836 + -0.1151461) * fVar125 + 0.116769984) *
                                 fVar125 + -0.12420141) * fVar125 + 0.14249323) * fVar125 +
                              -0.16668057) * fVar125 + 0.20000714) * fVar125 + -0.24999994) *
                            fVar125 + 0.3333333) * fVar125 + -0.5) * fVar125 * fVar125) * -2.0);
              auVar49._12_4_ =
                   ~-(uint)(auVar115._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar126 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar127 +
                          (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                                 fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                              -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) *
                            fVar127 + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) * -2.0);
              auVar61 = minps(auVar49 | auVar117,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar36 = auVar61._0_4_ * 1.442695 + fVar170;
              fVar44 = auVar61._4_4_ * 1.442695 + fVar174;
              fVar45 = auVar61._8_4_ * 1.442695 + fVar176;
              fVar46 = auVar61._12_4_ * 1.442695 + fVar178;
              fVar112 = (float)(int)fVar36;
              fVar125 = (float)(int)fVar44;
              fVar126 = (float)(int)fVar45;
              fVar127 = (float)(int)fVar46;
              fVar112 = fVar112 - (float)(-(uint)(fVar36 < fVar112) & 0x3f800000);
              fVar125 = fVar125 - (float)(-(uint)(fVar44 < fVar125) & 0x3f800000);
              fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & 0x3f800000);
              fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & 0x3f800000);
              fVar36 = auVar61._0_4_ - fVar112 * 0.6931472;
              fVar44 = auVar61._4_4_ - fVar125 * 0.6931472;
              fVar45 = auVar61._8_4_ - fVar126 * 0.6931472;
              fVar46 = auVar61._12_4_ - fVar127 * 0.6931472;
              auVar118._0_4_ =
                   (float)((int)fVar112 * 0x800000 + 0x3f800000) *
                   (fVar36 + 1.0 +
                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                     fVar166) * fVar36 + 0.16666666) * fVar36 + fVar170) * fVar36 * fVar36) + 1.0;
              auVar118._4_4_ =
                   (float)((int)fVar125 * 0x800000 + 0x3f800000) *
                   (fVar44 + 1.0 +
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     fVar167) * fVar44 + 0.16666666) * fVar44 + fVar174) * fVar44 * fVar44) + 1.0;
              auVar118._8_4_ =
                   (float)((int)fVar126 * 0x800000 + 0x3f800000) *
                   (fVar45 + 1.0 +
                   (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                     fVar168) * fVar45 + 0.16666666) * fVar45 + fVar176) * fVar45 * fVar45) + 1.0;
              auVar118._12_4_ =
                   (float)((int)fVar127 * 0x800000 + 0x3f800000) *
                   (fVar46 + 1.0 +
                   (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                     fVar169) * fVar46 + 0.16666666) * fVar46 + fVar178) * fVar46 * fVar46) + 1.0;
              auVar61 = divps(_DAT_0053a2b0,auVar118);
              auVar158._0_4_ = auVar61._0_4_ + -1.0;
              auVar158._4_4_ = auVar61._4_4_ + -1.0;
              auVar158._8_4_ = auVar61._8_4_ + -1.0;
              auVar158._12_4_ = auVar61._12_4_ + -1.0;
              goto LAB_00288862;
            case 6:
              pfVar21 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar166 = *pfVar21;
              fVar167 = pfVar21[1];
              auVar89._0_4_ = fVar166 * fVar48 + fVar167;
              auVar89._4_4_ = fVar166 * fVar79 + fVar167;
              auVar89._8_4_ = fVar166 * fVar81 + fVar167;
              auVar89._12_4_ = fVar166 * fVar83 + fVar167;
              auVar61 = maxps(auVar89,ZEXT816(0));
              auVar61 = minps(auVar61,_DAT_00539830);
              auVar84._0_4_ = auVar61._0_4_ * fVar48;
              auVar84._4_4_ = auVar61._4_4_ * fVar79;
              auVar84._8_4_ = auVar61._8_4_ * fVar81;
              auVar84._12_4_ = auVar61._12_4_ * fVar83;
              auVar136._0_4_ = fVar166 * fVar112 + fVar167;
              auVar136._4_4_ = fVar166 * fVar125 + fVar167;
              auVar136._8_4_ = fVar166 * fVar126 + fVar167;
              auVar136._12_4_ = fVar166 * fVar127 + fVar167;
              auVar61 = maxps(auVar136,ZEXT816(0));
              auVar61 = minps(auVar61,_DAT_00539830);
              auVar128._0_4_ = auVar61._0_4_ * fVar112;
              auVar128._4_4_ = auVar61._4_4_ * fVar125;
              auVar128._8_4_ = auVar61._8_4_ * fVar126;
              auVar128._12_4_ = auVar61._12_4_ * fVar127;
              auVar150._0_4_ = fVar166 * fVar36 + fVar167;
              auVar150._4_4_ = fVar166 * fVar44 + fVar167;
              auVar150._8_4_ = fVar166 * fVar45 + fVar167;
              auVar150._12_4_ = fVar166 * fVar46 + fVar167;
              auVar61 = maxps(auVar150,ZEXT816(0));
              auVar61 = minps(auVar61,_DAT_00539830);
              auVar146._0_4_ = auVar61._0_4_ * fVar36;
              auVar146._4_4_ = auVar61._4_4_ * fVar44;
              auVar146._8_4_ = auVar61._8_4_ * fVar45;
              auVar146._12_4_ = auVar61._12_4_ * fVar46;
              auVar157._0_4_ = fVar166 * fVar47 + fVar167;
              auVar157._4_4_ = fVar166 * fVar78 + fVar167;
              auVar157._8_4_ = fVar166 * fVar80 + fVar167;
              auVar157._12_4_ = fVar166 * fVar82 + fVar167;
              auVar61 = maxps(auVar157,ZEXT816(0));
              auVar158 = minps(auVar61,_DAT_00539830);
LAB_00288862:
              auVar154._0_4_ = auVar158._0_4_ * fVar47;
              auVar154._4_4_ = auVar158._4_4_ * fVar78;
              auVar154._8_4_ = auVar158._8_4_ * fVar80;
              auVar154._12_4_ = auVar158._12_4_ * fVar82;
            }
switchD_00287b40_caseD_1:
            auVar38._0_8_ = auVar84._0_8_;
            auVar38._8_4_ = auVar84._4_4_;
            auVar38._12_4_ = auVar128._4_4_;
            auVar52._0_8_ = auVar146._0_8_;
            auVar52._8_4_ = auVar146._4_4_;
            auVar52._12_4_ = auVar154._4_4_;
            auVar53._8_8_ = auVar52._8_8_;
            auVar120._12_4_ = auVar154._0_4_;
            auVar120._8_4_ = auVar146._0_4_;
            auVar90._0_8_ = CONCAT44(auVar128._8_4_,auVar84._8_4_);
            auVar90._8_4_ = auVar84._12_4_;
            auVar90._12_4_ = auVar128._12_4_;
            auVar151._0_8_ = CONCAT44(auVar154._8_4_,auVar146._8_4_);
            auVar151._8_4_ = auVar146._12_4_;
            auVar151._12_4_ = auVar154._12_4_;
            auVar120._4_4_ = auVar128._0_4_;
            auVar120._0_4_ = auVar84._0_4_;
            auVar53._0_8_ = auVar38._8_8_;
            auVar39._8_8_ = auVar151._0_8_;
            auVar39._0_8_ = auVar90._0_8_;
            auVar152._8_8_ = auVar151._8_8_;
            auVar152._0_8_ = auVar90._8_8_;
            *pauVar13 = auVar120;
            pauVar13[1] = auVar53;
            pauVar13[2] = auVar39;
            pauVar13[3] = auVar152;
            pauVar13 = pauVar13 + 4;
          }
        }
        if ((iVar23 == 1 & bVar19) != 0) {
          pauVar13 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (uVar18 = 0; uVar18 != local_88; uVar18 = uVar18 + 1) {
            if (pvVar5 == (void *)0x0) {
              auVar40 = ZEXT816(0);
            }
            else {
              auVar40 = *(undefined1 (*) [16])((long)pvVar5 + uVar18 * 0x10);
            }
            pfVar21 = (float *)((long)(this->weight_data_tm).w * uVar18 *
                                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data)
            ;
            lVar26 = 0;
            while( true ) {
              fVar47 = auVar40._0_4_;
              fVar78 = auVar40._4_4_;
              fVar80 = auVar40._8_4_;
              fVar82 = auVar40._12_4_;
              if (iVar25 == (int)lVar26) break;
              fVar36 = *(float *)((long)bottom_blob->data +
                                 lVar26 * 4 + bottom_blob->elemsize * uVar32 * (long)bottom_blob->w)
              ;
              auVar40._0_4_ = fVar47 + *pfVar21 * fVar36;
              auVar40._4_4_ = fVar78 + pfVar21[1] * fVar36;
              auVar40._8_4_ = fVar80 + pfVar21[2] * fVar36;
              auVar40._12_4_ = fVar82 + pfVar21[3] * fVar36;
              pfVar21 = pfVar21 + 4;
              lVar26 = lVar26 + 1;
            }
            auVar54 = auVar40;
            if (5 < iVar11 - 1U) goto switchD_00288967_caseD_1;
            auVar54 = maxps(auVar40,ZEXT816(0));
            fVar36 = (float)DAT_00539820;
            fVar44 = DAT_00539820._4_4_;
            fVar45 = DAT_00539820._8_4_;
            fVar46 = DAT_00539820._12_4_;
            switch(iVar11) {
            case 2:
              auVar61 = minps(auVar40,ZEXT816(0));
              fVar47 = *(this->super_InnerProduct).activation_params.data;
              auVar55._0_4_ = auVar54._0_4_ + fVar47 * auVar61._0_4_;
              auVar55._4_4_ = auVar54._4_4_ + fVar47 * auVar61._4_4_;
              auVar55._8_4_ = auVar54._8_4_ + fVar47 * auVar61._8_4_;
              auVar55._12_4_ = auVar54._12_4_ + fVar47 * auVar61._12_4_;
              auVar54 = auVar55;
              break;
            case 3:
              puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar3 = *puVar7;
              uVar2 = puVar7[1];
              auVar57._4_4_ = uVar3;
              auVar57._0_4_ = uVar3;
              auVar57._8_4_ = uVar3;
              auVar57._12_4_ = uVar3;
              auVar95._4_4_ = uVar2;
              auVar95._0_4_ = uVar2;
              auVar95._8_4_ = uVar2;
              auVar95._12_4_ = uVar2;
              auVar61 = maxps(auVar40,auVar57);
              auVar54 = minps(auVar61,auVar95);
              break;
            case 4:
              auVar41._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
              auVar41._8_4_ = -fVar80;
              auVar41._12_4_ = -fVar82;
              auVar61 = minps(auVar41,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar78 = auVar61._0_4_ * 1.442695 + fVar36;
              fVar82 = auVar61._4_4_ * 1.442695 + fVar44;
              fVar125 = auVar61._8_4_ * 1.442695 + fVar45;
              fVar127 = auVar61._12_4_ * 1.442695 + fVar46;
              fVar47 = (float)(int)fVar78;
              fVar80 = (float)(int)fVar82;
              fVar112 = (float)(int)fVar125;
              fVar126 = (float)(int)fVar127;
              fVar48 = (float)DAT_00539830;
              fVar79 = DAT_00539830._4_4_;
              fVar81 = DAT_00539830._8_4_;
              fVar83 = DAT_00539830._12_4_;
              fVar47 = fVar47 - (float)(-(uint)(fVar78 < fVar47) & (uint)fVar48);
              fVar80 = fVar80 - (float)(-(uint)(fVar82 < fVar80) & (uint)fVar79);
              fVar112 = fVar112 - (float)(-(uint)(fVar125 < fVar112) & (uint)fVar81);
              fVar126 = fVar126 - (float)(-(uint)(fVar127 < fVar126) & (uint)fVar83);
              fVar78 = fVar47 * -0.6931472 + auVar61._0_4_;
              fVar82 = fVar80 * -0.6931472 + auVar61._4_4_;
              fVar125 = fVar112 * -0.6931472 + auVar61._8_4_;
              fVar127 = fVar126 * -0.6931472 + auVar61._12_4_;
              auVar96._0_4_ =
                   (float)((int)fVar47 * 0x800000 + (int)fVar48) *
                   (fVar78 + fVar48 +
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + fVar36) * fVar78 * fVar78) +
                   fVar48;
              auVar96._4_4_ =
                   (float)((int)fVar80 * 0x800000 + (int)fVar79) *
                   (fVar82 + fVar79 +
                   (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82 +
                     0.041665796) * fVar82 + 0.16666666) * fVar82 + fVar44) * fVar82 * fVar82) +
                   fVar79;
              auVar96._8_4_ =
                   (float)((int)fVar112 * 0x800000 + (int)fVar81) *
                   (fVar125 + fVar81 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                     0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar45) * fVar125 * fVar125) +
                   fVar81;
              auVar96._12_4_ =
                   (float)((int)fVar126 * 0x800000 + (int)fVar83) *
                   (fVar127 + fVar83 +
                   (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                     0.041665796) * fVar127 + 0.16666666) * fVar127 + fVar46) * fVar127 * fVar127) +
                   fVar83;
              auVar54 = divps(_DAT_00539830,auVar96);
              break;
            case 5:
              auVar61 = minps(auVar40,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar112 = auVar61._0_4_ * 1.442695 + fVar36;
              fVar125 = auVar61._4_4_ * 1.442695 + fVar44;
              fVar126 = auVar61._8_4_ * 1.442695 + fVar45;
              fVar127 = auVar61._12_4_ * 1.442695 + fVar46;
              fVar48 = (float)(int)fVar112;
              fVar79 = (float)(int)fVar125;
              fVar81 = (float)(int)fVar126;
              fVar83 = (float)(int)fVar127;
              fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & 0x3f800000);
              fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & 0x3f800000);
              fVar81 = fVar81 - (float)(-(uint)(fVar126 < fVar81) & 0x3f800000);
              fVar83 = fVar83 - (float)(-(uint)(fVar127 < fVar83) & 0x3f800000);
              fVar112 = auVar61._0_4_ - fVar48 * 0.6931472;
              fVar125 = auVar61._4_4_ - fVar79 * 0.6931472;
              fVar126 = auVar61._8_4_ - fVar81 * 0.6931472;
              fVar127 = auVar61._12_4_ - fVar83 * 0.6931472;
              auVar91._0_4_ =
                   (float)((int)fVar48 * 0x800000 + 0x3f800000) *
                   (fVar112 + 1.0 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + (float)DAT_00539870) *
                      fVar112 + 0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar36) *
                   fVar112 * fVar112) + 1.0;
              auVar91._4_4_ =
                   (float)((int)fVar79 * 0x800000 + 0x3f800000) *
                   (fVar125 + 1.0 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + DAT_00539870._4_4_) *
                      fVar125 + 0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar44) *
                   fVar125 * fVar125) + 1.0;
              auVar91._8_4_ =
                   (float)((int)fVar81 * 0x800000 + 0x3f800000) *
                   (fVar126 + 1.0 +
                   (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + DAT_00539870._8_4_) *
                      fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar45) *
                   fVar126 * fVar126) + 1.0;
              auVar91._12_4_ =
                   (float)((int)fVar83 * 0x800000 + 0x3f800000) *
                   (fVar127 + 1.0 +
                   (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + DAT_00539870._12_4_) *
                      fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + fVar46) *
                   fVar127 * fVar127) + 1.0;
              auVar61 = maxps(auVar91,_DAT_005398a0);
              auVar92._0_8_ = auVar61._0_8_ & 0x807fffff807fffff;
              auVar92._8_4_ = auVar61._8_4_ & 0x807fffff;
              auVar92._12_4_ = auVar61._12_4_ & 0x807fffff;
              auVar92 = auVar92 | _DAT_00539820;
              fVar112 = auVar92._0_4_;
              fVar126 = auVar92._4_4_;
              fVar48 = auVar92._8_4_;
              fVar81 = auVar92._12_4_;
              fVar125 = fVar112 + (float)DAT_005398e0 +
                        (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
              fVar127 = fVar126 + DAT_005398e0._4_4_ +
                        (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
              fVar79 = fVar48 + DAT_005398e0._8_4_ +
                       (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
              fVar83 = fVar81 + DAT_005398e0._12_4_ +
                       (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
              auVar93._0_4_ =
                   ~-(uint)(auVar91._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar112 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar125 +
                          (((((((((fVar125 * 0.070376836 + -0.1151461) * fVar125 + 0.116769984) *
                                 fVar125 + -0.12420141) * fVar125 + 0.14249323) * fVar125 +
                              -0.16668057) * fVar125 + 0.20000714) * fVar125 + -0.24999994) *
                            fVar125 + 0.3333333) * fVar125 + -0.5) * fVar125 * fVar125) * -2.0);
              auVar93._4_4_ =
                   ~-(uint)(auVar91._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar126 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar127 +
                          (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                                 fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                              -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) *
                            fVar127 + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) * -2.0);
              auVar93._8_4_ =
                   ~-(uint)(auVar91._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar79
                          + (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                   fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 +
                                -0.16668057) * fVar79 + 0.20000714) * fVar79 + -0.24999994) * fVar79
                             + 0.3333333) * fVar79 + -0.5) * fVar79 * fVar79) * -2.0);
              auVar93._12_4_ =
                   ~-(uint)(auVar91._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar81 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar83
                          + (((((((((fVar83 * 0.070376836 + -0.1151461) * fVar83 + 0.116769984) *
                                   fVar83 + -0.12420141) * fVar83 + 0.14249323) * fVar83 +
                                -0.16668057) * fVar83 + 0.20000714) * fVar83 + -0.24999994) * fVar83
                             + 0.3333333) * fVar83 + -0.5) * fVar83 * fVar83) * -2.0);
              auVar56._0_8_ =
                   CONCAT44(-(uint)(auVar91._4_4_ <= 0.0),-(uint)(auVar91._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar56._8_4_ = -(uint)(auVar91._8_4_ <= 0.0) & 0x7fffffff;
              auVar56._12_4_ = -(uint)(auVar91._12_4_ <= 0.0) & 0x7fffffff;
              auVar61 = minps(auVar56 | auVar93,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar112 = auVar61._0_4_ * 1.442695 + fVar36;
              fVar125 = auVar61._4_4_ * 1.442695 + fVar44;
              fVar126 = auVar61._8_4_ * 1.442695 + fVar45;
              fVar127 = auVar61._12_4_ * 1.442695 + fVar46;
              fVar48 = (float)(int)fVar112;
              fVar79 = (float)(int)fVar125;
              fVar81 = (float)(int)fVar126;
              fVar83 = (float)(int)fVar127;
              fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & 0x3f800000);
              fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & 0x3f800000);
              fVar81 = fVar81 - (float)(-(uint)(fVar126 < fVar81) & 0x3f800000);
              fVar83 = fVar83 - (float)(-(uint)(fVar127 < fVar83) & 0x3f800000);
              fVar112 = auVar61._0_4_ - fVar48 * 0.6931472;
              fVar125 = auVar61._4_4_ - fVar79 * 0.6931472;
              fVar126 = auVar61._8_4_ - fVar81 * 0.6931472;
              fVar127 = auVar61._12_4_ - fVar83 * 0.6931472;
              auVar94._0_4_ =
                   (float)((int)fVar48 * 0x800000 + 0x3f800000) *
                   (fVar112 + 1.0 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + (float)DAT_00539870) *
                      fVar112 + 0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar36) *
                   fVar112 * fVar112) + 1.0;
              auVar94._4_4_ =
                   (float)((int)fVar79 * 0x800000 + 0x3f800000) *
                   (fVar125 + 1.0 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + DAT_00539870._4_4_) *
                      fVar125 + 0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar44) *
                   fVar125 * fVar125) + 1.0;
              auVar94._8_4_ =
                   (float)((int)fVar81 * 0x800000 + 0x3f800000) *
                   (fVar126 + 1.0 +
                   (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + DAT_00539870._8_4_) *
                      fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar45) *
                   fVar126 * fVar126) + 1.0;
              auVar94._12_4_ =
                   (float)((int)fVar83 * 0x800000 + 0x3f800000) *
                   (fVar127 + 1.0 +
                   (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + DAT_00539870._12_4_) *
                      fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + fVar46) *
                   fVar127 * fVar127) + 1.0;
              auVar61 = divps(_DAT_0053a2b0,auVar94);
              auVar59._0_4_ = auVar61._0_4_ + (float)DAT_005398e0;
              auVar59._4_4_ = auVar61._4_4_ + DAT_005398e0._4_4_;
              auVar59._8_4_ = auVar61._8_4_ + DAT_005398e0._8_4_;
              auVar59._12_4_ = auVar61._12_4_ + DAT_005398e0._12_4_;
              goto LAB_00288cba;
            case 6:
              pfVar21 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar36 = *pfVar21;
              fVar44 = pfVar21[1];
              auVar58._0_4_ = fVar36 * fVar47 + fVar44;
              auVar58._4_4_ = fVar36 * fVar78 + fVar44;
              auVar58._8_4_ = fVar36 * fVar80 + fVar44;
              auVar58._12_4_ = fVar36 * fVar82 + fVar44;
              auVar61 = maxps(auVar58,ZEXT816(0));
              auVar59 = minps(auVar61,_DAT_00539830);
LAB_00288cba:
              auVar54._0_4_ = auVar59._0_4_ * fVar47;
              auVar54._4_4_ = auVar59._4_4_ * fVar78;
              auVar54._8_4_ = auVar59._8_4_ * fVar80;
              auVar54._12_4_ = auVar59._12_4_ * fVar82;
            }
switchD_00288967_caseD_1:
            *pauVar13 = auVar54;
            pauVar13 = pauVar13 + 1;
          }
        }
        if ((iVar23 == 4 & (bVar19 ^ 1)) != 0) {
          pauVar13 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (uVar18 = 0; uVar18 != uVar4; uVar18 = uVar18 + 1) {
            fVar47 = 0.0;
            fVar78 = 0.0;
            fVar80 = 0.0;
            fVar82 = 0.0;
            auVar97 = ZEXT816(0);
            if (pvVar5 != (void *)0x0) {
              uVar3 = *(undefined4 *)((long)pvVar5 + uVar18 * 4);
              auVar97._4_4_ = (float)uVar3;
              auVar97._0_4_ = (float)uVar3;
              auVar97._8_4_ = (float)uVar3;
              auVar97._12_4_ = (float)uVar3;
            }
            pfVar21 = (float *)(uVar18 * (long)iVar20 * 4 + (long)(this->weight_data_tm).data);
            pauVar27 = (undefined1 (*) [16])
                       ((long)bottom_blob->w * uVar32 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
            fVar112 = 0.0;
            fVar125 = 0.0;
            fVar126 = 0.0;
            fVar127 = 0.0;
            fVar36 = 0.0;
            fVar44 = 0.0;
            fVar45 = 0.0;
            fVar46 = 0.0;
            for (iVar30 = 0; iVar30 + 3 < iVar20; iVar30 = iVar30 + 4) {
              auVar61 = *pauVar27;
              auVar113 = pauVar27[1];
              auVar72 = pauVar27[2];
              auVar86 = pauVar27[3];
              fVar48 = *pfVar21;
              fVar79 = pfVar21[1];
              fVar81 = pfVar21[2];
              fVar83 = pfVar21[3];
              auVar98._0_4_ = auVar97._0_4_ + fVar48 * auVar61._0_4_;
              auVar98._4_4_ = auVar97._4_4_ + fVar48 * auVar61._4_4_;
              auVar98._8_4_ = auVar97._8_4_ + fVar48 * auVar61._8_4_;
              auVar98._12_4_ = auVar97._12_4_ + fVar48 * auVar61._12_4_;
              fVar36 = fVar36 + fVar79 * auVar113._0_4_;
              fVar44 = fVar44 + fVar79 * auVar113._4_4_;
              fVar45 = fVar45 + fVar79 * auVar113._8_4_;
              fVar46 = fVar46 + fVar79 * auVar113._12_4_;
              fVar112 = fVar112 + fVar81 * auVar72._0_4_;
              fVar125 = fVar125 + fVar81 * auVar72._4_4_;
              fVar126 = fVar126 + fVar81 * auVar72._8_4_;
              fVar127 = fVar127 + fVar81 * auVar72._12_4_;
              fVar47 = fVar47 + fVar83 * auVar86._0_4_;
              fVar78 = fVar78 + fVar83 * auVar86._4_4_;
              fVar80 = fVar80 + fVar83 * auVar86._8_4_;
              fVar82 = fVar82 + fVar83 * auVar86._12_4_;
              pauVar27 = pauVar27 + 4;
              pfVar21 = pfVar21 + 4;
              auVar97 = auVar98;
            }
            lVar26 = 0;
            while( true ) {
              fVar81 = auVar97._12_4_;
              fVar48 = auVar97._4_4_;
              fVar79 = auVar97._8_4_;
              if (iVar20 <= iVar30) break;
              auVar61 = *(undefined1 (*) [16])(*pauVar27 + lVar26 * 4);
              fVar83 = *(float *)((long)pfVar21 + lVar26);
              auVar97._0_4_ = auVar97._0_4_ + fVar83 * auVar61._0_4_;
              auVar97._4_4_ = fVar48 + fVar83 * auVar61._4_4_;
              auVar97._8_4_ = fVar79 + fVar83 * auVar61._8_4_;
              auVar97._12_4_ = fVar81 + fVar83 * auVar61._12_4_;
              iVar30 = iVar30 + 1;
              lVar26 = lVar26 + 4;
            }
            fVar47 = fVar36 + auVar97._0_4_ + fVar112 + fVar47;
            fVar78 = fVar44 + fVar48 + fVar125 + fVar78;
            auVar42._0_8_ = CONCAT44(fVar78,fVar47);
            auVar42._8_4_ = fVar45 + fVar79 + fVar126 + fVar80;
            auVar42._12_4_ = fVar46 + fVar81 + fVar127 + fVar82;
            if (5 < iVar11 - 1U) {
              auVar65._8_4_ = auVar42._8_4_;
              auVar65._0_8_ = auVar42._0_8_;
              auVar65._12_4_ = auVar42._12_4_;
              goto switchD_00288df7_caseD_1;
            }
            auVar60._8_4_ = auVar42._8_4_;
            auVar60._0_8_ = auVar42._0_8_;
            auVar60._12_4_ = auVar42._12_4_;
            auVar61 = maxps(auVar60,ZEXT816(0));
            fVar80 = (float)DAT_00539820;
            fVar82 = DAT_00539820._4_4_;
            fVar36 = DAT_00539820._8_4_;
            fVar44 = DAT_00539820._12_4_;
            auVar65 = auVar61;
            switch(iVar11) {
            case 2:
              auVar113 = minps(auVar42,ZEXT816(0));
              fVar47 = *(this->super_InnerProduct).activation_params.data;
              auVar65._0_4_ = auVar61._0_4_ + fVar47 * auVar113._0_4_;
              auVar65._4_4_ = auVar61._4_4_ + fVar47 * auVar113._4_4_;
              auVar65._8_4_ = auVar61._8_4_ + fVar47 * auVar113._8_4_;
              auVar65._12_4_ = auVar61._12_4_ + fVar47 * auVar113._12_4_;
              break;
            case 3:
              puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
              uVar3 = *puVar7;
              uVar2 = puVar7[1];
              auVar64._4_4_ = uVar3;
              auVar64._0_4_ = uVar3;
              auVar64._8_4_ = uVar3;
              auVar64._12_4_ = uVar3;
              auVar103._4_4_ = uVar2;
              auVar103._0_4_ = uVar2;
              auVar103._8_4_ = uVar2;
              auVar103._12_4_ = uVar2;
              auVar61 = maxps(auVar42,auVar64);
              auVar65 = minps(auVar61,auVar103);
              break;
            case 4:
              auVar43._0_8_ = CONCAT44(fVar78,fVar47) ^ 0x8000000080000000;
              auVar43._8_4_ = -auVar42._8_4_;
              auVar43._12_4_ = -auVar42._12_4_;
              auVar61 = minps(auVar43,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar78 = auVar61._0_4_ * 1.442695 + fVar80;
              fVar46 = auVar61._4_4_ * 1.442695 + fVar82;
              fVar125 = auVar61._8_4_ * 1.442695 + fVar36;
              fVar127 = auVar61._12_4_ * 1.442695 + fVar44;
              fVar47 = (float)(int)fVar78;
              fVar45 = (float)(int)fVar46;
              fVar112 = (float)(int)fVar125;
              fVar126 = (float)(int)fVar127;
              fVar48 = (float)DAT_00539830;
              fVar79 = DAT_00539830._4_4_;
              fVar81 = DAT_00539830._8_4_;
              fVar83 = DAT_00539830._12_4_;
              fVar47 = fVar47 - (float)(-(uint)(fVar78 < fVar47) & (uint)fVar48);
              fVar45 = fVar45 - (float)(-(uint)(fVar46 < fVar45) & (uint)fVar79);
              fVar112 = fVar112 - (float)(-(uint)(fVar125 < fVar112) & (uint)fVar81);
              fVar126 = fVar126 - (float)(-(uint)(fVar127 < fVar126) & (uint)fVar83);
              fVar78 = fVar47 * -0.6931472 + auVar61._0_4_;
              fVar46 = fVar45 * -0.6931472 + auVar61._4_4_;
              fVar125 = fVar112 * -0.6931472 + auVar61._8_4_;
              fVar127 = fVar126 * -0.6931472 + auVar61._12_4_;
              auVar104._0_4_ =
                   (float)((int)fVar47 * 0x800000 + (int)fVar48) *
                   (fVar78 + fVar48 +
                   (((((fVar78 * 0.00019875691 + 0.0013981999) * fVar78 + 0.008333452) * fVar78 +
                     0.041665796) * fVar78 + 0.16666666) * fVar78 + fVar80) * fVar78 * fVar78) +
                   fVar48;
              auVar104._4_4_ =
                   (float)((int)fVar45 * 0x800000 + (int)fVar79) *
                   (fVar46 + fVar79 +
                   (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                     0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar82) * fVar46 * fVar46) +
                   fVar79;
              auVar104._8_4_ =
                   (float)((int)fVar112 * 0x800000 + (int)fVar81) *
                   (fVar125 + fVar81 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                     0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar36) * fVar125 * fVar125) +
                   fVar81;
              auVar104._12_4_ =
                   (float)((int)fVar126 * 0x800000 + (int)fVar83) *
                   (fVar127 + fVar83 +
                   (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                     0.041665796) * fVar127 + 0.16666666) * fVar127 + fVar44) * fVar127 * fVar127) +
                   fVar83;
              auVar65 = divps(_DAT_00539830,auVar104);
              break;
            case 5:
              auVar62._8_4_ = auVar42._8_4_;
              auVar62._0_8_ = auVar42._0_8_;
              auVar62._12_4_ = auVar42._12_4_;
              auVar61 = minps(auVar62,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar45 = auVar61._0_4_ * 1.442695 + fVar80;
              fVar46 = auVar61._4_4_ * 1.442695 + fVar82;
              fVar112 = auVar61._8_4_ * 1.442695 + fVar36;
              fVar125 = auVar61._12_4_ * 1.442695 + fVar44;
              fVar126 = (float)(int)fVar45;
              fVar127 = (float)(int)fVar46;
              fVar48 = (float)(int)fVar112;
              fVar79 = (float)(int)fVar125;
              fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & 0x3f800000);
              fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & 0x3f800000);
              fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & 0x3f800000);
              fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & 0x3f800000);
              fVar45 = auVar61._0_4_ - fVar126 * 0.6931472;
              fVar46 = auVar61._4_4_ - fVar127 * 0.6931472;
              fVar112 = auVar61._8_4_ - fVar48 * 0.6931472;
              fVar125 = auVar61._12_4_ - fVar79 * 0.6931472;
              auVar99._0_4_ =
                   (float)((int)fVar126 * 0x800000 + 0x3f800000) *
                   (fVar45 + 1.0 +
                   (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + (float)DAT_00539870) *
                      fVar45 + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar80) *
                   fVar45 * fVar45) + 1.0;
              auVar99._4_4_ =
                   (float)((int)fVar127 * 0x800000 + 0x3f800000) *
                   (fVar46 + 1.0 +
                   (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + DAT_00539870._4_4_) *
                      fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar82) *
                   fVar46 * fVar46) + 1.0;
              auVar99._8_4_ =
                   (float)((int)fVar48 * 0x800000 + 0x3f800000) *
                   (fVar112 + 1.0 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + DAT_00539870._8_4_) *
                      fVar112 + 0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar36) *
                   fVar112 * fVar112) + 1.0;
              auVar99._12_4_ =
                   (float)((int)fVar79 * 0x800000 + 0x3f800000) *
                   (fVar125 + 1.0 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + DAT_00539870._12_4_) *
                      fVar125 + 0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar44) *
                   fVar125 * fVar125) + 1.0;
              auVar61 = maxps(auVar99,_DAT_005398a0);
              auVar100._0_8_ = auVar61._0_8_ & 0x807fffff807fffff;
              auVar100._8_4_ = auVar61._8_4_ & 0x807fffff;
              auVar100._12_4_ = auVar61._12_4_ & 0x807fffff;
              auVar100 = auVar100 | _DAT_00539820;
              fVar45 = auVar100._0_4_;
              fVar112 = auVar100._4_4_;
              fVar126 = auVar100._8_4_;
              fVar48 = auVar100._12_4_;
              fVar46 = fVar45 + (float)DAT_005398e0 +
                       (float)(-(uint)(fVar45 < 0.70710677) & (uint)fVar45);
              fVar125 = fVar112 + DAT_005398e0._4_4_ +
                        (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
              fVar127 = fVar126 + DAT_005398e0._8_4_ +
                        (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
              fVar79 = fVar48 + DAT_005398e0._12_4_ +
                       (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
              auVar101._0_4_ =
                   ~-(uint)(auVar99._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar45 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar46
                          + (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) *
                                   fVar46 + -0.12420141) * fVar46 + 0.14249323) * fVar46 +
                                -0.16668057) * fVar46 + 0.20000714) * fVar46 + -0.24999994) * fVar46
                             + 0.3333333) * fVar46 + -0.5) * fVar46 * fVar46) * -2.0);
              auVar101._4_4_ =
                   ~-(uint)(auVar99._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar112 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar125 +
                          (((((((((fVar125 * 0.070376836 + -0.1151461) * fVar125 + 0.116769984) *
                                 fVar125 + -0.12420141) * fVar125 + 0.14249323) * fVar125 +
                              -0.16668057) * fVar125 + 0.20000714) * fVar125 + -0.24999994) *
                            fVar125 + 0.3333333) * fVar125 + -0.5) * fVar125 * fVar125) * -2.0);
              auVar101._8_4_ =
                   ~-(uint)(auVar99._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar126 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                           fVar127 +
                          (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                                 fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                              -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) *
                            fVar127 + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) * -2.0);
              auVar101._12_4_ =
                   ~-(uint)(auVar99._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar61._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar79
                          + (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                   fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 +
                                -0.16668057) * fVar79 + 0.20000714) * fVar79 + -0.24999994) * fVar79
                             + 0.3333333) * fVar79 + -0.5) * fVar79 * fVar79) * -2.0);
              auVar63._0_8_ =
                   CONCAT44(-(uint)(auVar99._4_4_ <= 0.0),-(uint)(auVar99._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar63._8_4_ = -(uint)(auVar99._8_4_ <= 0.0) & 0x7fffffff;
              auVar63._12_4_ = -(uint)(auVar99._12_4_ <= 0.0) & 0x7fffffff;
              auVar61 = minps(auVar63 | auVar101,_DAT_005397f0);
              auVar61 = maxps(auVar61,_DAT_00539800);
              fVar45 = auVar61._0_4_ * 1.442695 + fVar80;
              fVar46 = auVar61._4_4_ * 1.442695 + fVar82;
              fVar112 = auVar61._8_4_ * 1.442695 + fVar36;
              fVar125 = auVar61._12_4_ * 1.442695 + fVar44;
              fVar126 = (float)(int)fVar45;
              fVar127 = (float)(int)fVar46;
              fVar48 = (float)(int)fVar112;
              fVar79 = (float)(int)fVar125;
              fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & 0x3f800000);
              fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & 0x3f800000);
              fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & 0x3f800000);
              fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & 0x3f800000);
              fVar45 = auVar61._0_4_ - fVar126 * 0.6931472;
              fVar46 = auVar61._4_4_ - fVar127 * 0.6931472;
              fVar112 = auVar61._8_4_ - fVar48 * 0.6931472;
              fVar125 = auVar61._12_4_ - fVar79 * 0.6931472;
              auVar102._0_4_ =
                   (float)((int)fVar126 * 0x800000 + 0x3f800000) *
                   (fVar45 + 1.0 +
                   (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + (float)DAT_00539870) *
                      fVar45 + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar80) *
                   fVar45 * fVar45) + 1.0;
              auVar102._4_4_ =
                   (float)((int)fVar127 * 0x800000 + 0x3f800000) *
                   (fVar46 + 1.0 +
                   (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + DAT_00539870._4_4_) *
                      fVar46 + 0.041665796) * fVar46 + 0.16666666) * fVar46 + fVar82) *
                   fVar46 * fVar46) + 1.0;
              auVar102._8_4_ =
                   (float)((int)fVar48 * 0x800000 + 0x3f800000) *
                   (fVar112 + 1.0 +
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + DAT_00539870._8_4_) *
                      fVar112 + 0.041665796) * fVar112 + 0.16666666) * fVar112 + fVar36) *
                   fVar112 * fVar112) + 1.0;
              auVar102._12_4_ =
                   (float)((int)fVar79 * 0x800000 + 0x3f800000) *
                   (fVar125 + 1.0 +
                   (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + DAT_00539870._12_4_) *
                      fVar125 + 0.041665796) * fVar125 + 0.16666666) * fVar125 + fVar44) *
                   fVar125 * fVar125) + 1.0;
              auVar61 = divps(_DAT_0053a2b0,auVar102);
              auVar67._0_4_ = auVar61._0_4_ + (float)DAT_005398e0;
              auVar67._4_4_ = auVar61._4_4_ + DAT_005398e0._4_4_;
              auVar67._8_4_ = auVar61._8_4_ + DAT_005398e0._8_4_;
              auVar67._12_4_ = auVar61._12_4_ + DAT_005398e0._12_4_;
              goto LAB_0028914a;
            case 6:
              pfVar21 = (float *)(this->super_InnerProduct).activation_params.data;
              fVar80 = *pfVar21;
              fVar82 = pfVar21[1];
              auVar66._0_4_ = fVar80 * fVar47 + fVar82;
              auVar66._4_4_ = fVar80 * fVar78 + fVar82;
              auVar66._8_4_ = fVar80 * auVar42._8_4_ + fVar82;
              auVar66._12_4_ = fVar80 * auVar42._12_4_ + fVar82;
              auVar61 = maxps(auVar66,ZEXT816(0));
              auVar67 = minps(auVar61,_DAT_00539830);
LAB_0028914a:
              auVar65._0_4_ = auVar67._0_4_ * fVar47;
              auVar65._4_4_ = auVar67._4_4_ * fVar78;
              auVar65._8_4_ = auVar67._8_4_ * auVar42._8_4_;
              auVar65._12_4_ = auVar67._12_4_ * auVar42._12_4_;
            }
switchD_00288df7_caseD_1:
            *pauVar13 = auVar65;
            pauVar13 = pauVar13 + 1;
          }
        }
        if (((bVar19 ^ 1) & iVar23 == 1) != 0) {
          pfVar24 = (float *)((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data
                             );
          pfVar21 = (float *)(this->super_InnerProduct).activation_params.data;
          iVar30 = bottom_blob->w;
          sVar8 = bottom_blob->elemsize;
          pvVar6 = (this->weight_data_tm).data;
          pvVar9 = bottom_blob->data;
          for (uVar18 = 0; uVar18 != uVar4; uVar18 = uVar18 + 1) {
            if (pvVar5 == (void *)0x0) {
              fVar47 = 0.0;
            }
            else {
              fVar47 = *(float *)((long)pvVar5 + uVar18 * 4);
            }
            pfVar14 = (float *)((long)pvVar6 + uVar18 * (long)iVar20 * 4);
            iVar17 = 0;
            auVar68 = ZEXT816(0);
            pfVar22 = (float *)((long)iVar30 * uVar32 * sVar8 + (long)pvVar9);
            while( true ) {
              fVar82 = auVar68._12_4_;
              fVar78 = auVar68._4_4_;
              fVar80 = auVar68._8_4_;
              if (iVar20 <= iVar17 + 3) break;
              auVar68._0_4_ = auVar68._0_4_ + *pfVar14 * *pfVar22;
              auVar68._4_4_ = fVar78 + pfVar14[1] * pfVar22[1];
              auVar68._8_4_ = fVar80 + pfVar14[2] * pfVar22[2];
              auVar68._12_4_ = fVar82 + pfVar14[3] * pfVar22[3];
              pfVar22 = pfVar22 + 4;
              pfVar14 = pfVar14 + 4;
              iVar17 = iVar17 + 4;
            }
            lVar26 = 0;
            for (; iVar17 < iVar20; iVar17 = iVar17 + 1) {
              fVar47 = fVar47 + pfVar14[lVar26] * pfVar22[lVar26];
              lVar26 = lVar26 + 1;
            }
            fVar47 = fVar82 + fVar78 + fVar80 + auVar68._0_4_ + fVar47;
            fVar78 = fVar47;
            switch(iVar11) {
            case 1:
              if (fVar47 <= 0.0) {
                fVar78 = 0.0;
              }
              break;
            case 2:
              fVar78 = (float)(~-(uint)(0.0 < fVar47) & (uint)*pfVar21 |
                              -(uint)(0.0 < fVar47) & 0x3f800000) * fVar47;
              break;
            case 3:
              if (fVar47 <= *pfVar21) {
                fVar47 = *pfVar21;
              }
              fVar78 = pfVar21[1];
              if (fVar47 <= pfVar21[1]) {
                fVar78 = fVar47;
              }
              break;
            case 4:
              if (88.37626 <= fVar47) {
                fVar47 = 88.37626;
              }
              fVar47 = expf((float)(-(uint)(fVar47 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar47 < -88.37626) & (uint)-fVar47));
              fVar78 = 1.0 / (fVar47 + 1.0);
              break;
            case 5:
              fVar78 = expf(fVar47);
              fVar78 = logf(fVar78 + 1.0);
              fVar78 = tanhf(fVar78);
              fVar78 = fVar78 * fVar47;
              break;
            case 6:
              fVar80 = *pfVar21;
              fVar82 = -pfVar21[1] / fVar80;
              fVar78 = 0.0;
              if ((fVar82 <= fVar47) && (fVar78 = fVar47, fVar47 <= fVar82 + 1.0 / fVar80)) {
                fVar78 = (fVar80 * fVar47 + pfVar21[1]) * fVar47;
              }
            }
            *pfVar24 = fVar78;
            pfVar24 = pfVar24 + 1;
          }
        }
        uVar32 = uVar32 + 1;
      } while( true );
    }
  }
  else {
    local_a4 = bottom_blob->w;
  }
  local_d0 = (float *)bottom_blob->data;
  local_c8 = bottom_blob->refcount;
  local_c0 = bottom_blob->elemsize;
  local_b8 = bottom_blob->elempack;
  local_b0 = bottom_blob->allocator;
  local_a0._0_4_ = bottom_blob->h;
  local_a0._4_4_ = bottom_blob->d;
  local_98 = bottom_blob->c;
  local_90 = bottom_blob->cstep;
  iVar11 = local_a8;
  if (local_c8 != (int *)0x0) {
    LOCK();
    *local_c8 = *local_c8 + 1;
    UNLOCK();
    iVar11 = bottom_blob->dims;
  }
  iVar20 = -100;
  if (iVar11 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_d0);
    if ((local_d0 == (float *)0x0) || ((long)local_98 * local_90 == 0)) goto LAB_0028a18e;
  }
  uVar4 = (this->super_InnerProduct).num_output;
  bVar19 = (uVar4 & 3) == 0 & opt->use_packing_layout;
  iVar11 = (uint)bVar19 + (uint)bVar19 * 2 + 1;
  Mat::create(top_blob,(int)uVar4 / iVar11,local_c0 / (ulong)(long)local_b8 << bVar19 * '\x02',
              iVar11,opt->blob_allocator);
  pfVar21 = local_d0;
  auVar61 = _DAT_00539830;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar11 = (this->super_InnerProduct).activation_type;
    iVar23 = local_b8 * local_a4;
    uVar4 = top_blob->w;
    pvVar5 = (this->super_InnerProduct).bias_data.data;
    fVar47 = (float)DAT_00539830;
    fVar78 = DAT_00539830._4_4_;
    fVar80 = DAT_00539830._8_4_;
    fVar82 = DAT_00539830._12_4_;
    if (top_blob->elempack == 1) {
      uVar18 = 0;
      uVar32 = (ulong)(uint)((int)uVar4 >> 2);
      if ((int)uVar4 >> 2 < 1) {
        uVar32 = uVar18;
      }
      lVar15 = (long)iVar23;
      lVar26 = lVar15 * 4;
      lVar28 = lVar15 * 0x10;
      lVar31 = lVar15 * 8;
      lVar34 = lVar15 * 0xc;
      for (uVar29 = 0; auVar113 = ZEXT816(0), uVar29 != uVar32; uVar29 = uVar29 + 1) {
        fVar112 = 0.0;
        fVar125 = 0.0;
        fVar126 = 0.0;
        fVar127 = 0.0;
        fVar36 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        if (pvVar5 != (void *)0x0) {
          pfVar24 = (float *)((long)pvVar5 + uVar29 * 0x10);
          fVar36 = *pfVar24;
          fVar44 = pfVar24[1];
          fVar45 = pfVar24[2];
          fVar46 = pfVar24[3];
        }
        pvVar6 = (this->weight_data_tm).data;
        lVar33 = 0;
        lVar16 = 0;
        fVar171 = 0.0;
        fVar175 = 0.0;
        fVar177 = 0.0;
        fVar179 = 0.0;
        fVar48 = 0.0;
        fVar79 = 0.0;
        fVar81 = 0.0;
        fVar83 = 0.0;
        fVar166 = 0.0;
        fVar167 = 0.0;
        fVar168 = 0.0;
        fVar169 = 0.0;
        for (iVar20 = 0; iVar20 + 3 < iVar23; iVar20 = iVar20 + 4) {
          pfVar24 = (float *)((long)local_d0 + lVar16);
          fVar170 = *pfVar24;
          fVar174 = pfVar24[1];
          fVar176 = pfVar24[2];
          fVar178 = pfVar24[3];
          pfVar24 = (float *)((long)pvVar6 + lVar16 + uVar18);
          pfVar14 = (float *)((long)pvVar6 + lVar16 + lVar26);
          pfVar22 = (float *)((long)pvVar6 + lVar16 + lVar31);
          pfVar1 = (float *)((long)pvVar6 + lVar16 + lVar34);
          fVar166 = fVar166 + *pfVar24 * fVar170;
          fVar167 = fVar167 + pfVar24[1] * fVar174;
          fVar168 = fVar168 + pfVar24[2] * fVar176;
          fVar169 = fVar169 + pfVar24[3] * fVar178;
          fVar112 = fVar112 + *pfVar14 * fVar170;
          fVar125 = fVar125 + pfVar14[1] * fVar174;
          fVar126 = fVar126 + pfVar14[2] * fVar176;
          fVar127 = fVar127 + pfVar14[3] * fVar178;
          fVar171 = fVar171 + *pfVar22 * fVar170;
          fVar175 = fVar175 + pfVar22[1] * fVar174;
          fVar177 = fVar177 + pfVar22[2] * fVar176;
          fVar179 = fVar179 + pfVar22[3] * fVar178;
          fVar48 = fVar48 + *pfVar1 * fVar170;
          fVar79 = fVar79 + pfVar1[1] * fVar174;
          fVar81 = fVar81 + pfVar1[2] * fVar176;
          fVar83 = fVar83 + pfVar1[3] * fVar178;
          lVar16 = lVar16 + 0x10;
          lVar33 = lVar33 + 4;
        }
        for (; (int)lVar33 < iVar23; lVar33 = lVar33 + 1) {
          fVar170 = local_d0[lVar33];
          fVar36 = fVar36 + fVar170 * *(float *)((long)pvVar6 + lVar33 * 4 + uVar18);
          fVar44 = fVar44 + fVar170 * *(float *)((long)pvVar6 + lVar33 * 4 + lVar26);
          fVar45 = fVar45 + fVar170 * *(float *)((long)pvVar6 + lVar33 * 4 + lVar31);
          fVar46 = fVar46 + fVar170 * *(float *)((long)pvVar6 + lVar33 * 4 + lVar34);
        }
        fVar36 = fVar169 + fVar168 + fVar167 + fVar166 + fVar36;
        fVar44 = fVar127 + fVar126 + fVar125 + fVar112 + fVar44;
        auVar172._0_8_ = CONCAT44(fVar44,fVar36);
        auVar172._8_4_ = fVar179 + fVar177 + fVar175 + fVar171 + fVar45;
        auVar172._12_4_ = fVar83 + fVar81 + fVar79 + fVar48 + fVar46;
        if (5 < iVar11 - 1U) {
          auVar75._8_4_ = auVar172._8_4_;
          auVar75._0_8_ = auVar172._0_8_;
          auVar75._12_4_ = auVar172._12_4_;
          goto switchD_00289be2_caseD_1;
        }
        auVar71._8_4_ = auVar172._8_4_;
        auVar71._0_8_ = auVar172._0_8_;
        auVar71._12_4_ = auVar172._12_4_;
        auVar72 = maxps(auVar71,auVar113);
        auVar75 = auVar72;
        switch(iVar11) {
        case 2:
          auVar113 = minps(auVar172,auVar113);
          fVar36 = *(this->super_InnerProduct).activation_params.data;
          auVar75._0_4_ = auVar72._0_4_ + fVar36 * auVar113._0_4_;
          auVar75._4_4_ = auVar72._4_4_ + fVar36 * auVar113._4_4_;
          auVar75._8_4_ = auVar72._8_4_ + fVar36 * auVar113._8_4_;
          auVar75._12_4_ = auVar72._12_4_ + fVar36 * auVar113._12_4_;
          break;
        case 3:
          puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar3 = *puVar7;
          uVar2 = puVar7[1];
          auVar74._4_4_ = uVar3;
          auVar74._0_4_ = uVar3;
          auVar74._8_4_ = uVar3;
          auVar74._12_4_ = uVar3;
          auVar110._4_4_ = uVar2;
          auVar110._0_4_ = uVar2;
          auVar110._8_4_ = uVar2;
          auVar110._12_4_ = uVar2;
          auVar113 = maxps(auVar172,auVar74);
          auVar75 = minps(auVar113,auVar110);
          break;
        case 4:
          auVar173._0_8_ = CONCAT44(fVar44,fVar36) ^ 0x8000000080000000;
          auVar173._8_4_ = -auVar172._8_4_;
          auVar173._12_4_ = -auVar172._12_4_;
          auVar113 = minps(auVar173,_DAT_005397f0);
          auVar113 = maxps(auVar113,_DAT_00539800);
          fVar44 = auVar113._0_4_ * 1.442695 + 0.5;
          fVar46 = auVar113._4_4_ * 1.442695 + 0.5;
          fVar125 = auVar113._8_4_ * 1.442695 + 0.5;
          fVar127 = auVar113._12_4_ * 1.442695 + 0.5;
          fVar36 = (float)(int)fVar44;
          fVar45 = (float)(int)fVar46;
          fVar112 = (float)(int)fVar125;
          fVar126 = (float)(int)fVar127;
          fVar36 = fVar36 - (float)(-(uint)(fVar44 < fVar36) & (uint)fVar47);
          fVar45 = fVar45 - (float)(-(uint)(fVar46 < fVar45) & (uint)fVar78);
          fVar112 = fVar112 - (float)(-(uint)(fVar125 < fVar112) & (uint)fVar80);
          fVar126 = fVar126 - (float)(-(uint)(fVar127 < fVar126) & (uint)fVar82);
          fVar44 = fVar36 * -0.6931472 + auVar113._0_4_;
          fVar46 = fVar45 * -0.6931472 + auVar113._4_4_;
          fVar125 = fVar112 * -0.6931472 + auVar113._8_4_;
          fVar127 = fVar126 * -0.6931472 + auVar113._12_4_;
          auVar111._0_4_ =
               (float)((int)fVar36 * 0x800000 + (int)fVar47) *
               (fVar44 + fVar47 +
               (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                 0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * fVar44 * fVar44) + fVar47;
          auVar111._4_4_ =
               (float)((int)fVar45 * 0x800000 + (int)fVar78) *
               (fVar46 + fVar78 +
               (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                 0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar78;
          auVar111._8_4_ =
               (float)((int)fVar112 * 0x800000 + (int)fVar80) *
               (fVar125 + fVar80 +
               (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                 0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5) * fVar125 * fVar125) + fVar80
          ;
          auVar111._12_4_ =
               (float)((int)fVar126 * 0x800000 + (int)fVar82) *
               (fVar127 + fVar82 +
               (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) * fVar127 * fVar127) + fVar82
          ;
          auVar75 = divps(auVar61,auVar111);
          break;
        case 5:
          auVar73._8_4_ = auVar172._8_4_;
          auVar73._0_8_ = auVar172._0_8_;
          auVar73._12_4_ = auVar172._12_4_;
          auVar113 = minps(auVar73,_DAT_005397f0);
          auVar113 = maxps(auVar113,_DAT_00539800);
          fVar45 = auVar113._0_4_ * 1.442695 + 0.5;
          fVar46 = auVar113._4_4_ * 1.442695 + 0.5;
          fVar112 = auVar113._8_4_ * 1.442695 + 0.5;
          fVar125 = auVar113._12_4_ * 1.442695 + 0.5;
          fVar126 = (float)(int)fVar45;
          fVar127 = (float)(int)fVar46;
          fVar48 = (float)(int)fVar112;
          fVar79 = (float)(int)fVar125;
          fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & (uint)fVar47);
          fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & (uint)fVar78);
          fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & (uint)fVar80);
          fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & (uint)fVar82);
          fVar45 = auVar113._0_4_ - fVar126 * 0.6931472;
          fVar46 = auVar113._4_4_ - fVar127 * 0.6931472;
          fVar112 = auVar113._8_4_ - fVar48 * 0.6931472;
          fVar125 = auVar113._12_4_ - fVar79 * 0.6931472;
          auVar165._0_4_ =
               (float)((int)fVar126 * 0x800000 + (int)fVar47) *
               (fVar45 + fVar47 +
               (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                 0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar47;
          auVar165._4_4_ =
               (float)((int)fVar127 * 0x800000 + (int)fVar78) *
               (fVar46 + fVar78 +
               (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                 0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar78;
          auVar165._8_4_ =
               (float)((int)fVar48 * 0x800000 + (int)fVar80) *
               (fVar112 + fVar80 +
               (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                 0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5) * fVar112 * fVar112) + fVar80
          ;
          auVar165._12_4_ =
               (float)((int)fVar79 * 0x800000 + (int)fVar82) *
               (fVar125 + fVar82 +
               (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                 0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5) * fVar125 * fVar125) + fVar82
          ;
          auVar113 = maxps(auVar165,_DAT_005398a0);
          fVar45 = (float)(auVar113._0_4_ & 0x807fffff | 0x3f000000);
          fVar112 = (float)(auVar113._4_4_ & 0x807fffff | 0x3f000000);
          fVar126 = (float)(auVar113._8_4_ & 0x807fffff | 0x3f000000);
          fVar48 = (float)(auVar113._12_4_ & 0x807fffff | 0x3f000000);
          fVar46 = fVar45 + (float)DAT_005398e0 +
                   (float)(-(uint)(fVar45 < 0.70710677) & (uint)fVar45);
          fVar125 = fVar112 + DAT_005398e0._4_4_ +
                    (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
          fVar127 = fVar126 + DAT_005398e0._8_4_ +
                    (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
          fVar79 = fVar48 + DAT_005398e0._12_4_ +
                   (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
          auVar108._0_4_ =
               ~-(uint)(auVar165._0_4_ <= 0.0) &
               (uint)((((float)(int)((auVar113._0_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar45 < 0.70710677) & (uint)fVar47)) * 0.6931472 + fVar46 +
                      (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                            -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 +
                         0.20000714) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5)
                      * fVar46 * fVar46) * -2.0);
          auVar108._4_4_ =
               ~-(uint)(auVar165._4_4_ <= 0.0) &
               (uint)((((float)(int)((auVar113._4_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar78)) * 0.6931472 + fVar125
                      + (((((((((fVar125 * 0.070376836 + -0.1151461) * fVar125 + 0.116769984) *
                               fVar125 + -0.12420141) * fVar125 + 0.14249323) * fVar125 +
                            -0.16668057) * fVar125 + 0.20000714) * fVar125 + -0.24999994) * fVar125
                         + 0.3333333) * fVar125 + -0.5) * fVar125 * fVar125) * -2.0);
          auVar108._8_4_ =
               ~-(uint)(auVar165._8_4_ <= 0.0) &
               (uint)((((float)(int)((auVar113._8_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar80)) * 0.6931472 + fVar127
                      + (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                               fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                            -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) * fVar127
                         + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) * -2.0);
          auVar108._12_4_ =
               ~-(uint)(auVar165._12_4_ <= 0.0) &
               (uint)((((float)(int)((auVar113._12_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar82)) * 0.6931472 + fVar79 +
                      (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) * fVar79 +
                            -0.12420141) * fVar79 + 0.14249323) * fVar79 + -0.16668057) * fVar79 +
                         0.20000714) * fVar79 + -0.24999994) * fVar79 + 0.3333333) * fVar79 + -0.5)
                      * fVar79 * fVar79) * -2.0);
          auVar153._0_8_ =
               CONCAT44(-(uint)(auVar165._4_4_ <= 0.0),-(uint)(auVar165._0_4_ <= 0.0)) &
               0x7fffffff7fffffff;
          auVar153._8_4_ = -(uint)(auVar165._8_4_ <= 0.0) & 0x7fffffff;
          auVar153._12_4_ = -(uint)(auVar165._12_4_ <= 0.0) & 0x7fffffff;
          auVar113 = minps(auVar153 | auVar108,_DAT_005397f0);
          auVar113 = maxps(auVar113,_DAT_00539800);
          fVar126 = auVar113._0_4_ * 1.442695 + 0.5;
          fVar127 = auVar113._4_4_ * 1.442695 + 0.5;
          fVar48 = auVar113._8_4_ * 1.442695 + 0.5;
          fVar79 = auVar113._12_4_ * 1.442695 + 0.5;
          fVar45 = (float)(int)fVar126;
          fVar46 = (float)(int)fVar127;
          fVar112 = (float)(int)fVar48;
          fVar125 = (float)(int)fVar79;
          fVar45 = fVar45 - (float)(-(uint)(fVar126 < fVar45) & (uint)fVar47);
          fVar46 = fVar46 - (float)(-(uint)(fVar127 < fVar46) & (uint)fVar78);
          fVar112 = fVar112 - (float)(-(uint)(fVar48 < fVar112) & (uint)fVar80);
          fVar125 = fVar125 - (float)(-(uint)(fVar79 < fVar125) & (uint)fVar82);
          fVar126 = auVar113._0_4_ - fVar45 * 0.6931472;
          fVar127 = auVar113._4_4_ - fVar46 * 0.6931472;
          fVar48 = auVar113._8_4_ - fVar112 * 0.6931472;
          fVar79 = auVar113._12_4_ - fVar125 * 0.6931472;
          auVar109._0_4_ =
               (float)((int)fVar45 * 0x800000 + (int)fVar47) *
               (fVar126 + fVar47 +
               (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) * fVar126 * fVar126) + fVar47
          ;
          auVar109._4_4_ =
               (float)((int)fVar46 * 0x800000 + (int)fVar78) *
               (fVar127 + fVar78 +
               (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) * fVar127 * fVar127) + fVar78
          ;
          auVar109._8_4_ =
               (float)((int)fVar112 * 0x800000 + (int)fVar80) *
               (fVar48 + fVar80 +
               (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                 0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48) + fVar80;
          auVar109._12_4_ =
               (float)((int)fVar125 * 0x800000 + (int)fVar82) *
               (fVar79 + fVar82 +
               (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79 +
                 0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * fVar79 * fVar79) + fVar82;
          auVar113 = divps(_DAT_0053a2b0,auVar109);
          auVar77._0_4_ = auVar113._0_4_ + (float)DAT_005398e0;
          auVar77._4_4_ = auVar113._4_4_ + DAT_005398e0._4_4_;
          auVar77._8_4_ = auVar113._8_4_ + DAT_005398e0._8_4_;
          auVar77._12_4_ = auVar113._12_4_ + DAT_005398e0._12_4_;
          goto LAB_00289f30;
        case 6:
          pfVar24 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar45 = *pfVar24;
          fVar46 = pfVar24[1];
          auVar76._0_4_ = fVar45 * fVar36 + fVar46;
          auVar76._4_4_ = fVar45 * fVar44 + fVar46;
          auVar76._8_4_ = fVar45 * auVar172._8_4_ + fVar46;
          auVar76._12_4_ = fVar45 * auVar172._12_4_ + fVar46;
          auVar113 = maxps(auVar76,auVar113);
          auVar77 = minps(auVar113,auVar61);
LAB_00289f30:
          auVar75._0_4_ = auVar77._0_4_ * fVar36;
          auVar75._4_4_ = auVar77._4_4_ * fVar44;
          auVar75._8_4_ = auVar77._8_4_ * auVar172._8_4_;
          auVar75._12_4_ = auVar77._12_4_ * auVar172._12_4_;
        }
switchD_00289be2_caseD_1:
        *(undefined1 (*) [16])((long)top_blob->data + uVar29 * 0x10) = auVar75;
        lVar26 = lVar26 + lVar28;
        lVar31 = lVar31 + lVar28;
        lVar34 = lVar34 + lVar28;
        uVar18 = uVar18 + lVar28;
      }
      pfVar24 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar6 = (this->weight_data_tm).data;
      pvVar9 = top_blob->data;
      for (uVar32 = (long)(int)uVar4 & 0xfffffffffffffffc; (long)uVar32 < (long)(int)uVar4;
          uVar32 = uVar32 + 1) {
        if (pvVar5 == (void *)0x0) {
          fVar47 = 0.0;
        }
        else {
          fVar47 = *(float *)((long)pvVar5 + uVar32 * 4);
        }
        pfVar14 = (float *)((long)pvVar6 + uVar32 * lVar15 * 4);
        fVar78 = 0.0;
        fVar80 = 0.0;
        fVar82 = 0.0;
        fVar36 = 0.0;
        pfVar22 = pfVar21;
        for (iVar20 = 0; iVar20 + 3 < iVar23; iVar20 = iVar20 + 4) {
          fVar78 = fVar78 + *pfVar14 * *pfVar22;
          fVar80 = fVar80 + pfVar14[1] * pfVar22[1];
          fVar82 = fVar82 + pfVar14[2] * pfVar22[2];
          fVar36 = fVar36 + pfVar14[3] * pfVar22[3];
          pfVar22 = pfVar22 + 4;
          pfVar14 = pfVar14 + 4;
        }
        lVar26 = 0;
        for (; iVar20 < iVar23; iVar20 = iVar20 + 1) {
          fVar47 = fVar47 + pfVar14[lVar26] * pfVar22[lVar26];
          lVar26 = lVar26 + 1;
        }
        fVar47 = fVar36 + fVar80 + fVar82 + fVar78 + fVar47;
        fVar78 = fVar47;
        switch(iVar11) {
        case 1:
          if (fVar47 <= 0.0) {
            fVar78 = 0.0;
          }
          break;
        case 2:
          fVar78 = (float)(~-(uint)(0.0 < fVar47) & (uint)*pfVar24 |
                          -(uint)(0.0 < fVar47) & 0x3f800000) * fVar47;
          break;
        case 3:
          if (fVar47 <= *pfVar24) {
            fVar47 = *pfVar24;
          }
          fVar78 = pfVar24[1];
          if (fVar47 <= pfVar24[1]) {
            fVar78 = fVar47;
          }
          break;
        case 4:
          if (88.37626 <= fVar47) {
            fVar47 = 88.37626;
          }
          fVar47 = expf((float)(-(uint)(fVar47 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar47 < -88.37626) & (uint)-fVar47));
          fVar78 = 1.0 / (fVar47 + 1.0);
          break;
        case 5:
          fVar78 = expf(fVar47);
          fVar78 = logf(fVar78 + 1.0);
          fVar78 = tanhf(fVar78);
          fVar78 = fVar78 * fVar47;
          break;
        case 6:
          fVar80 = *pfVar24;
          fVar82 = -pfVar24[1] / fVar80;
          fVar78 = 0.0;
          if ((fVar82 <= fVar47) && (fVar78 = fVar47, fVar47 <= fVar82 + 1.0 / fVar80)) {
            fVar78 = (fVar80 * fVar47 + pfVar24[1]) * fVar47;
          }
        }
        *(float *)((long)pvVar9 + uVar32 * 4) = fVar78;
      }
      iVar20 = 0;
    }
    else {
      iVar20 = 0;
      if (top_blob->elempack == 4) {
        iVar20 = 0;
        uVar32 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar32 = 0;
        }
        for (uVar18 = 0; auVar113 = ZEXT816(0), uVar18 != uVar32; uVar18 = uVar18 + 1) {
          fVar112 = 0.0;
          fVar125 = 0.0;
          fVar126 = 0.0;
          fVar127 = 0.0;
          fVar36 = 0.0;
          fVar44 = 0.0;
          fVar45 = 0.0;
          fVar46 = 0.0;
          if (pvVar5 != (void *)0x0) {
            pfVar21 = (float *)((long)pvVar5 + uVar18 * 0x10);
            fVar36 = *pfVar21;
            fVar44 = pfVar21[1];
            fVar45 = pfVar21[2];
            fVar46 = pfVar21[3];
          }
          pfVar24 = (float *)((long)(this->weight_data_tm).w * uVar18 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          fVar166 = 0.0;
          fVar167 = 0.0;
          fVar168 = 0.0;
          fVar169 = 0.0;
          fVar48 = 0.0;
          fVar79 = 0.0;
          fVar81 = 0.0;
          fVar83 = 0.0;
          pfVar21 = local_d0;
          for (iVar25 = 0; iVar25 + 3 < iVar23; iVar25 = iVar25 + 4) {
            fVar171 = *pfVar21;
            fVar175 = pfVar21[1];
            fVar177 = pfVar21[2];
            fVar179 = pfVar21[3];
            fVar36 = fVar36 + *pfVar24 * fVar171;
            fVar44 = fVar44 + pfVar24[1] * fVar171;
            fVar45 = fVar45 + pfVar24[2] * fVar171;
            fVar46 = fVar46 + pfVar24[3] * fVar171;
            fVar48 = fVar48 + pfVar24[4] * fVar175;
            fVar79 = fVar79 + pfVar24[5] * fVar175;
            fVar81 = fVar81 + pfVar24[6] * fVar175;
            fVar83 = fVar83 + pfVar24[7] * fVar175;
            fVar166 = fVar166 + pfVar24[8] * fVar177;
            fVar167 = fVar167 + pfVar24[9] * fVar177;
            fVar168 = fVar168 + pfVar24[10] * fVar177;
            fVar169 = fVar169 + pfVar24[0xb] * fVar177;
            fVar112 = fVar112 + pfVar24[0xc] * fVar179;
            fVar125 = fVar125 + pfVar24[0xd] * fVar179;
            fVar126 = fVar126 + pfVar24[0xe] * fVar179;
            fVar127 = fVar127 + pfVar24[0xf] * fVar179;
            pfVar21 = pfVar21 + 4;
            pfVar24 = pfVar24 + 0x10;
          }
          lVar26 = 0;
          for (; iVar25 < iVar23; iVar25 = iVar25 + 1) {
            fVar171 = *(float *)((long)pfVar21 + lVar26);
            pfVar14 = pfVar24 + lVar26;
            fVar36 = fVar36 + *pfVar14 * fVar171;
            fVar44 = fVar44 + pfVar14[1] * fVar171;
            fVar45 = fVar45 + pfVar14[2] * fVar171;
            fVar46 = fVar46 + pfVar14[3] * fVar171;
            lVar26 = lVar26 + 4;
          }
          fVar36 = fVar48 + fVar36 + fVar166 + fVar112;
          fVar44 = fVar79 + fVar44 + fVar167 + fVar125;
          auVar69._0_8_ = CONCAT44(fVar44,fVar36);
          auVar69._8_4_ = fVar81 + fVar45 + fVar168 + fVar126;
          auVar69._12_4_ = fVar83 + fVar46 + fVar169 + fVar127;
          auVar160 = auVar69;
          if (5 < iVar11 - 1U) goto switchD_0028969a_caseD_1;
          auVar159._8_4_ = auVar69._8_4_;
          auVar159._0_8_ = auVar69._0_8_;
          auVar159._12_4_ = auVar69._12_4_;
          auVar160 = maxps(auVar159,auVar113);
          switch(iVar11) {
          case 2:
            auVar113 = minps(auVar69,auVar113);
            fVar36 = *(this->super_InnerProduct).activation_params.data;
            auVar161._0_4_ = auVar160._0_4_ + fVar36 * auVar113._0_4_;
            auVar161._4_4_ = auVar160._4_4_ + fVar36 * auVar113._4_4_;
            auVar161._8_4_ = auVar160._8_4_ + fVar36 * auVar113._8_4_;
            auVar161._12_4_ = auVar160._12_4_ + fVar36 * auVar113._12_4_;
            auVar160 = auVar161;
            break;
          case 3:
            puVar7 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar3 = *puVar7;
            uVar2 = puVar7[1];
            auVar107._4_4_ = uVar3;
            auVar107._0_4_ = uVar3;
            auVar107._8_4_ = uVar3;
            auVar107._12_4_ = uVar3;
            auVar123._4_4_ = uVar2;
            auVar123._0_4_ = uVar2;
            auVar123._8_4_ = uVar2;
            auVar123._12_4_ = uVar2;
            auVar113 = maxps(auVar69,auVar107);
            auVar160 = minps(auVar113,auVar123);
            break;
          case 4:
            auVar70._0_8_ = CONCAT44(fVar44,fVar36) ^ 0x8000000080000000;
            auVar70._8_4_ = -auVar69._8_4_;
            auVar70._12_4_ = -auVar69._12_4_;
            auVar113 = minps(auVar70,_DAT_005397f0);
            auVar113 = maxps(auVar113,_DAT_00539800);
            fVar44 = auVar113._0_4_ * 1.442695 + 0.5;
            fVar46 = auVar113._4_4_ * 1.442695 + 0.5;
            fVar125 = auVar113._8_4_ * 1.442695 + 0.5;
            fVar127 = auVar113._12_4_ * 1.442695 + 0.5;
            fVar36 = (float)(int)fVar44;
            fVar45 = (float)(int)fVar46;
            fVar112 = (float)(int)fVar125;
            fVar126 = (float)(int)fVar127;
            fVar36 = fVar36 - (float)(-(uint)(fVar44 < fVar36) & (uint)fVar47);
            fVar45 = fVar45 - (float)(-(uint)(fVar46 < fVar45) & (uint)fVar78);
            fVar112 = fVar112 - (float)(-(uint)(fVar125 < fVar112) & (uint)fVar80);
            fVar126 = fVar126 - (float)(-(uint)(fVar127 < fVar126) & (uint)fVar82);
            fVar44 = fVar36 * -0.6931472 + auVar113._0_4_;
            fVar46 = fVar45 * -0.6931472 + auVar113._4_4_;
            fVar125 = fVar112 * -0.6931472 + auVar113._8_4_;
            fVar127 = fVar126 * -0.6931472 + auVar113._12_4_;
            auVar124._0_4_ =
                 (float)((int)fVar36 * 0x800000 + (int)fVar47) *
                 (fVar44 + fVar47 +
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * fVar44 * fVar44) + fVar47;
            auVar124._4_4_ =
                 (float)((int)fVar45 * 0x800000 + (int)fVar78) *
                 (fVar46 + fVar78 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar78;
            auVar124._8_4_ =
                 (float)((int)fVar112 * 0x800000 + (int)fVar80) *
                 (fVar125 + fVar80 +
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5) * fVar125 * fVar125) +
                 fVar80;
            auVar124._12_4_ =
                 (float)((int)fVar126 * 0x800000 + (int)fVar82) *
                 (fVar127 + fVar82 +
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) * fVar127 * fVar127) +
                 fVar82;
            auVar160 = divps(auVar61,auVar124);
            break;
          case 5:
            auVar105._8_4_ = auVar69._8_4_;
            auVar105._0_8_ = auVar69._0_8_;
            auVar105._12_4_ = auVar69._12_4_;
            auVar113 = minps(auVar105,_DAT_005397f0);
            auVar113 = maxps(auVar113,_DAT_00539800);
            fVar45 = auVar113._0_4_ * 1.442695 + 0.5;
            fVar46 = auVar113._4_4_ * 1.442695 + 0.5;
            fVar112 = auVar113._8_4_ * 1.442695 + 0.5;
            fVar125 = auVar113._12_4_ * 1.442695 + 0.5;
            fVar126 = (float)(int)fVar45;
            fVar127 = (float)(int)fVar46;
            fVar48 = (float)(int)fVar112;
            fVar79 = (float)(int)fVar125;
            fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & (uint)fVar47);
            fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & (uint)fVar78);
            fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & (uint)fVar80);
            fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & (uint)fVar82);
            fVar45 = auVar113._0_4_ - fVar126 * 0.6931472;
            fVar46 = auVar113._4_4_ - fVar127 * 0.6931472;
            fVar112 = auVar113._8_4_ - fVar48 * 0.6931472;
            fVar125 = auVar113._12_4_ - fVar79 * 0.6931472;
            auVar162._0_4_ =
                 (float)((int)fVar126 * 0x800000 + (int)fVar47) *
                 (fVar45 + fVar47 +
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar47;
            auVar162._4_4_ =
                 (float)((int)fVar127 * 0x800000 + (int)fVar78) *
                 (fVar46 + fVar78 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar78;
            auVar162._8_4_ =
                 (float)((int)fVar48 * 0x800000 + (int)fVar80) *
                 (fVar112 + fVar80 +
                 (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                   0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5) * fVar112 * fVar112) +
                 fVar80;
            auVar162._12_4_ =
                 (float)((int)fVar79 * 0x800000 + (int)fVar82) *
                 (fVar125 + fVar82 +
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5) * fVar125 * fVar125) +
                 fVar82;
            auVar113 = maxps(auVar162,_DAT_005398a0);
            fVar45 = (float)(auVar113._0_4_ & 0x807fffff | 0x3f000000);
            fVar112 = (float)(auVar113._4_4_ & 0x807fffff | 0x3f000000);
            fVar126 = (float)(auVar113._8_4_ & 0x807fffff | 0x3f000000);
            fVar48 = (float)(auVar113._12_4_ & 0x807fffff | 0x3f000000);
            fVar46 = fVar45 + -1.0 + (float)(-(uint)(fVar45 < 0.70710677) & (uint)fVar45);
            fVar125 = fVar112 + -1.0 + (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar112);
            fVar127 = fVar126 + -1.0 + (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
            fVar79 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
            auVar121._0_4_ =
                 ~-(uint)(auVar162._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar113._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar45 < 0.70710677) & (uint)fVar47)) * 0.6931472 + fVar46
                        + (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) *
                                 fVar46 + -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057
                              ) * fVar46 + 0.20000714) * fVar46 + -0.24999994) * fVar46 + 0.3333333)
                           * fVar46 + -0.5) * fVar46 * fVar46) * -2.0);
            auVar121._4_4_ =
                 ~-(uint)(auVar162._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar113._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar112 < 0.70710677) & (uint)fVar78)) * 0.6931472 +
                         fVar125 +
                        (((((((((fVar125 * 0.070376836 + -0.1151461) * fVar125 + 0.116769984) *
                               fVar125 + -0.12420141) * fVar125 + 0.14249323) * fVar125 +
                            -0.16668057) * fVar125 + 0.20000714) * fVar125 + -0.24999994) * fVar125
                         + 0.3333333) * fVar125 + -0.5) * fVar125 * fVar125) * -2.0);
            auVar121._8_4_ =
                 ~-(uint)(auVar162._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar113._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar80)) * 0.6931472 +
                         fVar127 +
                        (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984) *
                               fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127 +
                            -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994) * fVar127
                         + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) * -2.0);
            auVar121._12_4_ =
                 ~-(uint)(auVar162._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar113._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar82)) * 0.6931472 + fVar79
                        + (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                 fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 + -0.16668057
                              ) * fVar79 + 0.20000714) * fVar79 + -0.24999994) * fVar79 + 0.3333333)
                           * fVar79 + -0.5) * fVar79 * fVar79) * -2.0);
            auVar106._0_8_ =
                 CONCAT44(-(uint)(auVar162._4_4_ <= 0.0),-(uint)(auVar162._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar106._8_4_ = -(uint)(auVar162._8_4_ <= 0.0) & 0x7fffffff;
            auVar106._12_4_ = -(uint)(auVar162._12_4_ <= 0.0) & 0x7fffffff;
            auVar113 = minps(auVar106 | auVar121,_DAT_005397f0);
            auVar113 = maxps(auVar113,_DAT_00539800);
            fVar45 = auVar113._0_4_ * 1.442695 + 0.5;
            fVar46 = auVar113._4_4_ * 1.442695 + 0.5;
            fVar112 = auVar113._8_4_ * 1.442695 + 0.5;
            fVar125 = auVar113._12_4_ * 1.442695 + 0.5;
            fVar126 = (float)(int)fVar45;
            fVar127 = (float)(int)fVar46;
            fVar48 = (float)(int)fVar112;
            fVar79 = (float)(int)fVar125;
            fVar126 = fVar126 - (float)(-(uint)(fVar45 < fVar126) & (uint)fVar47);
            fVar127 = fVar127 - (float)(-(uint)(fVar46 < fVar127) & (uint)fVar78);
            fVar48 = fVar48 - (float)(-(uint)(fVar112 < fVar48) & (uint)fVar80);
            fVar79 = fVar79 - (float)(-(uint)(fVar125 < fVar79) & (uint)fVar82);
            fVar45 = auVar113._0_4_ - fVar126 * 0.6931472;
            fVar46 = auVar113._4_4_ - fVar127 * 0.6931472;
            fVar112 = auVar113._8_4_ - fVar48 * 0.6931472;
            fVar125 = auVar113._12_4_ - fVar79 * 0.6931472;
            auVar122._0_4_ =
                 (float)((int)fVar126 * 0x800000 + (int)fVar47) *
                 (fVar45 + fVar47 +
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar47;
            auVar122._4_4_ =
                 (float)((int)fVar127 * 0x800000 + (int)fVar78) *
                 (fVar46 + fVar78 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar78;
            auVar122._8_4_ =
                 (float)((int)fVar48 * 0x800000 + (int)fVar80) *
                 (fVar112 + fVar80 +
                 (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                   0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5) * fVar112 * fVar112) +
                 fVar80;
            auVar122._12_4_ =
                 (float)((int)fVar79 * 0x800000 + (int)fVar82) *
                 (fVar125 + fVar82 +
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5) * fVar125 * fVar125) +
                 fVar82;
            auVar113 = divps(_DAT_0053a2b0,auVar122);
            auVar164._0_4_ = auVar113._0_4_ + -1.0;
            auVar164._4_4_ = auVar113._4_4_ + -1.0;
            auVar164._8_4_ = auVar113._8_4_ + -1.0;
            auVar164._12_4_ = auVar113._12_4_ + -1.0;
            goto LAB_002899e9;
          case 6:
            pfVar21 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar45 = *pfVar21;
            fVar46 = pfVar21[1];
            auVar163._0_4_ = fVar45 * fVar36 + fVar46;
            auVar163._4_4_ = fVar45 * fVar44 + fVar46;
            auVar163._8_4_ = fVar45 * auVar69._8_4_ + fVar46;
            auVar163._12_4_ = fVar45 * auVar69._12_4_ + fVar46;
            auVar113 = maxps(auVar163,auVar113);
            auVar164 = minps(auVar113,auVar61);
LAB_002899e9:
            auVar160._0_4_ = auVar164._0_4_ * fVar36;
            auVar160._4_4_ = auVar164._4_4_ * fVar44;
            auVar160._8_4_ = auVar164._8_4_ * auVar69._8_4_;
            auVar160._12_4_ = auVar164._12_4_ * auVar69._12_4_;
          }
switchD_0028969a_caseD_1:
          *(undefined1 (*) [16])((long)top_blob->data + uVar18 * 0x10) = auVar160;
        }
      }
    }
  }
LAB_0028a18e:
  if (local_c8 != (int *)0x0) {
    LOCK();
    *local_c8 = *local_c8 + -1;
    UNLOCK();
    if (*local_c8 == 0) {
      if (local_b0 == (Allocator *)0x0) {
        free(local_d0);
      }
      else {
        (*local_b0->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}